

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_h<embree::sse2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  int iVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined6 uVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  int iVar50;
  ulong uVar51;
  long lVar52;
  RTCFilterFunctionN p_Var53;
  RTCRayN *pRVar54;
  undefined4 uVar55;
  RTCIntersectArguments *pRVar56;
  undefined1 *puVar57;
  ulong uVar58;
  Geometry *pGVar59;
  ulong uVar60;
  bool bVar61;
  ulong uVar62;
  Geometry *geometry;
  long lVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  short sVar70;
  undefined2 uVar99;
  float fVar71;
  float fVar100;
  float fVar101;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined8 uVar102;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar103;
  float fVar126;
  float fVar127;
  undefined1 auVar104 [16];
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar128;
  float fVar134;
  float fVar135;
  vfloat4 v;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar148;
  float fVar151;
  vfloat4 v_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar143 [16];
  float fVar149;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar156;
  float fVar157;
  float fVar168;
  float fVar170;
  undefined1 auVar158 [16];
  float fVar169;
  float fVar171;
  float fVar172;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar173;
  float fVar196;
  float fVar197;
  undefined1 auVar174 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar198;
  float fVar202;
  float fVar203;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar204;
  float fVar205;
  float fVar212;
  float fVar214;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  float fVar213;
  float fVar215;
  float fVar216;
  undefined1 auVar211 [16];
  float fVar217;
  float fVar219;
  float fVar220;
  undefined1 auVar218 [16];
  float fVar221;
  float fVar228;
  float fVar229;
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar233 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar256;
  float fVar258;
  float fVar260;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar254 [16];
  float fVar257;
  float fVar259;
  float fVar261;
  undefined1 auVar255 [16];
  float fVar262;
  float fVar263;
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar275;
  float fVar276;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar288;
  float fVar290;
  float fVar291;
  undefined1 auVar289 [16];
  float fVar292;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined4 uStack_41c;
  float local_418;
  float local_408;
  float fStack_404;
  float fStack_400;
  float fStack_3fc;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [16];
  ulong local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 (*local_308) [16];
  Precalculations *local_300;
  RTCFilterFunctionNArguments local_2f8;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  LinearSpace3fa *local_228;
  Primitive *local_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  uint local_198;
  int local_194;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  float local_138 [4];
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118 [4];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 uVar98;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  
  PVar17 = prim[1];
  uVar51 = (ulong)(byte)PVar17;
  lVar23 = uVar51 * 0x25;
  pPVar7 = prim + lVar23 + 6;
  fVar135 = *(float *)(pPVar7 + 0xc);
  fVar136 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar135;
  fVar148 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar135;
  fVar151 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar135;
  fVar128 = *(float *)(ray + k * 4 + 0x40) * fVar135;
  fVar134 = *(float *)(ray + k * 4 + 0x50) * fVar135;
  fVar135 = *(float *)(ray + k * 4 + 0x60) * fVar135;
  uVar55 = *(undefined4 *)(prim + uVar51 * 4 + 6);
  uVar98 = (undefined1)((uint)uVar55 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar55 >> 0x10);
  uVar102 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar55));
  uVar98 = (undefined1)((uint)uVar55 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar102 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar24,sVar70);
  auVar226._8_4_ = 0;
  auVar226._0_8_ = uVar60;
  auVar226._12_2_ = uVar99;
  auVar226._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar102 >> 0x20);
  auVar130._12_4_ = auVar226._12_4_;
  auVar130._8_2_ = 0;
  auVar130._0_8_ = uVar60;
  auVar130._10_2_ = uVar99;
  auVar72._10_6_ = auVar130._10_6_;
  auVar72._8_2_ = uVar99;
  auVar72._0_8_ = uVar60;
  uVar99 = (undefined2)uVar24;
  auVar25._4_8_ = auVar72._8_8_;
  auVar25._2_2_ = uVar99;
  auVar25._0_2_ = uVar99;
  fVar275 = (float)((int)sVar70 >> 8);
  fVar282 = (float)(auVar25._0_4_ >> 0x18);
  fVar283 = (float)(auVar72._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar51 * 5 + 6);
  uVar98 = (undefined1)((uint)uVar55 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar55 >> 0x10);
  uVar102 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar55));
  uVar98 = (undefined1)((uint)uVar55 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar102 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar24,sVar70);
  auVar106._8_4_ = 0;
  auVar106._0_8_ = uVar60;
  auVar106._12_2_ = uVar99;
  auVar106._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar102 >> 0x20);
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._8_2_ = 0;
  auVar105._0_8_ = uVar60;
  auVar105._10_2_ = uVar99;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._8_2_ = uVar99;
  auVar104._0_8_ = uVar60;
  uVar99 = (undefined2)uVar24;
  auVar26._4_8_ = auVar104._8_8_;
  auVar26._2_2_ = uVar99;
  auVar26._0_2_ = uVar99;
  fVar156 = (float)((int)sVar70 >> 8);
  fVar168 = (float)(auVar26._0_4_ >> 0x18);
  fVar170 = (float)(auVar104._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar51 * 6 + 6);
  uVar98 = (undefined1)((uint)uVar55 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar55 >> 0x10);
  uVar102 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar55));
  uVar98 = (undefined1)((uint)uVar55 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar102 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar24,sVar70);
  auVar109._8_4_ = 0;
  auVar109._0_8_ = uVar60;
  auVar109._12_2_ = uVar99;
  auVar109._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar102 >> 0x20);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._8_2_ = 0;
  auVar108._0_8_ = uVar60;
  auVar108._10_2_ = uVar99;
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._8_2_ = uVar99;
  auVar107._0_8_ = uVar60;
  uVar99 = (undefined2)uVar24;
  auVar27._4_8_ = auVar107._8_8_;
  auVar27._2_2_ = uVar99;
  auVar27._0_2_ = uVar99;
  fVar198 = (float)((int)sVar70 >> 8);
  fVar202 = (float)(auVar27._0_4_ >> 0x18);
  fVar203 = (float)(auVar107._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar51 * 0xf + 6);
  uVar98 = (undefined1)((uint)uVar55 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar55 >> 0x10);
  uVar102 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar55));
  uVar98 = (undefined1)((uint)uVar55 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar102 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar24,sVar70);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar60;
  auVar112._12_2_ = uVar99;
  auVar112._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar102 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar60;
  auVar111._10_2_ = uVar99;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar99;
  auVar110._0_8_ = uVar60;
  uVar99 = (undefined2)uVar24;
  auVar28._4_8_ = auVar110._8_8_;
  auVar28._2_2_ = uVar99;
  auVar28._0_2_ = uVar99;
  fVar71 = (float)((int)sVar70 >> 8);
  fVar100 = (float)(auVar28._0_4_ >> 0x18);
  fVar101 = (float)(auVar110._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar98 = (undefined1)((uint)uVar55 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar55 >> 0x10);
  uVar102 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar55));
  uVar98 = (undefined1)((uint)uVar55 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar102 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar24,sVar70);
  auVar176._8_4_ = 0;
  auVar176._0_8_ = uVar60;
  auVar176._12_2_ = uVar99;
  auVar176._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar102 >> 0x20);
  auVar175._12_4_ = auVar176._12_4_;
  auVar175._8_2_ = 0;
  auVar175._0_8_ = uVar60;
  auVar175._10_2_ = uVar99;
  auVar174._10_6_ = auVar175._10_6_;
  auVar174._8_2_ = uVar99;
  auVar174._0_8_ = uVar60;
  uVar99 = (undefined2)uVar24;
  auVar29._4_8_ = auVar174._8_8_;
  auVar29._2_2_ = uVar99;
  auVar29._0_2_ = uVar99;
  fVar204 = (float)((int)sVar70 >> 8);
  fVar212 = (float)(auVar29._0_4_ >> 0x18);
  fVar214 = (float)(auVar174._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + uVar51 + 6);
  uVar98 = (undefined1)((uint)uVar55 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar55 >> 0x10);
  uVar102 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar55));
  uVar98 = (undefined1)((uint)uVar55 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar102 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar24,sVar70);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar60;
  auVar179._12_2_ = uVar99;
  auVar179._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar102 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar60;
  auVar178._10_2_ = uVar99;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar99;
  auVar177._0_8_ = uVar60;
  uVar99 = (undefined2)uVar24;
  auVar30._4_8_ = auVar177._8_8_;
  auVar30._2_2_ = uVar99;
  auVar30._0_2_ = uVar99;
  fVar221 = (float)((int)sVar70 >> 8);
  fVar228 = (float)(auVar30._0_4_ >> 0x18);
  fVar229 = (float)(auVar177._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar51 * 0x1a + 6);
  uVar98 = (undefined1)((uint)uVar55 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar55 >> 0x10);
  uVar102 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar55));
  uVar98 = (undefined1)((uint)uVar55 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar102 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar24,sVar70);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar60;
  auVar182._12_2_ = uVar99;
  auVar182._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar102 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar60;
  auVar181._10_2_ = uVar99;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar99;
  auVar180._0_8_ = uVar60;
  uVar99 = (undefined2)uVar24;
  auVar31._4_8_ = auVar180._8_8_;
  auVar31._2_2_ = uVar99;
  auVar31._0_2_ = uVar99;
  fVar217 = (float)((int)sVar70 >> 8);
  fVar219 = (float)(auVar31._0_4_ >> 0x18);
  fVar220 = (float)(auVar180._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar51 * 0x1b + 6);
  uVar98 = (undefined1)((uint)uVar55 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar55 >> 0x10);
  uVar102 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar55));
  uVar98 = (undefined1)((uint)uVar55 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar102 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar24,sVar70);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar60;
  auVar185._12_2_ = uVar99;
  auVar185._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar102 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar60;
  auVar184._10_2_ = uVar99;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar99;
  auVar183._0_8_ = uVar60;
  uVar99 = (undefined2)uVar24;
  auVar32._4_8_ = auVar183._8_8_;
  auVar32._2_2_ = uVar99;
  auVar32._0_2_ = uVar99;
  fVar230 = (float)((int)sVar70 >> 8);
  fVar240 = (float)(auVar32._0_4_ >> 0x18);
  fVar243 = (float)(auVar183._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar51 * 0x1c + 6);
  uVar98 = (undefined1)((uint)uVar55 >> 0x18);
  uVar99 = CONCAT11(uVar98,uVar98);
  uVar98 = (undefined1)((uint)uVar55 >> 0x10);
  uVar102 = CONCAT35(CONCAT21(uVar99,uVar98),CONCAT14(uVar98,uVar55));
  uVar98 = (undefined1)((uint)uVar55 >> 8);
  uVar24 = CONCAT51(CONCAT41((int)((ulong)uVar102 >> 0x20),uVar98),uVar98);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar60 = CONCAT62(uVar24,sVar70);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar60;
  auVar188._12_2_ = uVar99;
  auVar188._14_2_ = uVar99;
  uVar99 = (undefined2)((ulong)uVar102 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar60;
  auVar187._10_2_ = uVar99;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar99;
  auVar186._0_8_ = uVar60;
  uVar99 = (undefined2)uVar24;
  auVar33._4_8_ = auVar186._8_8_;
  auVar33._2_2_ = uVar99;
  auVar33._0_2_ = uVar99;
  fVar103 = (float)((int)sVar70 >> 8);
  fVar126 = (float)(auVar33._0_4_ >> 0x18);
  fVar127 = (float)(auVar186._8_4_ >> 0x18);
  fVar262 = fVar128 * fVar275 + fVar134 * fVar156 + fVar135 * fVar198;
  fVar272 = fVar128 * fVar282 + fVar134 * fVar168 + fVar135 * fVar202;
  fVar273 = fVar128 * fVar283 + fVar134 * fVar170 + fVar135 * fVar203;
  fVar274 = fVar128 * (float)(auVar130._12_4_ >> 0x18) +
            fVar134 * (float)(auVar105._12_4_ >> 0x18) + fVar135 * (float)(auVar108._12_4_ >> 0x18);
  fVar248 = fVar128 * fVar71 + fVar134 * fVar204 + fVar135 * fVar221;
  fVar256 = fVar128 * fVar100 + fVar134 * fVar212 + fVar135 * fVar228;
  fVar258 = fVar128 * fVar101 + fVar134 * fVar214 + fVar135 * fVar229;
  fVar260 = fVar128 * (float)(auVar111._12_4_ >> 0x18) +
            fVar134 * (float)(auVar175._12_4_ >> 0x18) + fVar135 * (float)(auVar178._12_4_ >> 0x18);
  fVar173 = fVar128 * fVar217 + fVar134 * fVar230 + fVar135 * fVar103;
  fVar196 = fVar128 * fVar219 + fVar134 * fVar240 + fVar135 * fVar126;
  fVar197 = fVar128 * fVar220 + fVar134 * fVar243 + fVar135 * fVar127;
  fVar128 = fVar128 * (float)(auVar181._12_4_ >> 0x18) +
            fVar134 * (float)(auVar184._12_4_ >> 0x18) + fVar135 * (float)(auVar187._12_4_ >> 0x18);
  fVar276 = fVar275 * fVar136 + fVar156 * fVar148 + fVar198 * fVar151;
  fVar282 = fVar282 * fVar136 + fVar168 * fVar148 + fVar202 * fVar151;
  fVar283 = fVar283 * fVar136 + fVar170 * fVar148 + fVar203 * fVar151;
  fVar284 = (float)(auVar130._12_4_ >> 0x18) * fVar136 +
            (float)(auVar105._12_4_ >> 0x18) * fVar148 + (float)(auVar108._12_4_ >> 0x18) * fVar151;
  fVar221 = fVar71 * fVar136 + fVar204 * fVar148 + fVar221 * fVar151;
  fVar228 = fVar100 * fVar136 + fVar212 * fVar148 + fVar228 * fVar151;
  fVar229 = fVar101 * fVar136 + fVar214 * fVar148 + fVar229 * fVar151;
  fVar275 = (float)(auVar111._12_4_ >> 0x18) * fVar136 +
            (float)(auVar175._12_4_ >> 0x18) * fVar148 + (float)(auVar178._12_4_ >> 0x18) * fVar151;
  fVar217 = fVar136 * fVar217 + fVar148 * fVar230 + fVar151 * fVar103;
  fVar219 = fVar136 * fVar219 + fVar148 * fVar240 + fVar151 * fVar126;
  fVar220 = fVar136 * fVar220 + fVar148 * fVar243 + fVar151 * fVar127;
  fVar230 = fVar136 * (float)(auVar181._12_4_ >> 0x18) +
            fVar148 * (float)(auVar184._12_4_ >> 0x18) + fVar151 * (float)(auVar187._12_4_ >> 0x18);
  fVar135 = (float)DAT_01f80d30;
  fVar71 = DAT_01f80d30._4_4_;
  fVar100 = DAT_01f80d30._8_4_;
  fVar101 = DAT_01f80d30._12_4_;
  uVar64 = -(uint)(fVar135 <= ABS(fVar262));
  uVar65 = -(uint)(fVar71 <= ABS(fVar272));
  uVar66 = -(uint)(fVar100 <= ABS(fVar273));
  uVar67 = -(uint)(fVar101 <= ABS(fVar274));
  auVar264._0_4_ = (uint)fVar262 & uVar64;
  auVar264._4_4_ = (uint)fVar272 & uVar65;
  auVar264._8_4_ = (uint)fVar273 & uVar66;
  auVar264._12_4_ = (uint)fVar274 & uVar67;
  auVar139._0_4_ = ~uVar64 & (uint)fVar135;
  auVar139._4_4_ = ~uVar65 & (uint)fVar71;
  auVar139._8_4_ = ~uVar66 & (uint)fVar100;
  auVar139._12_4_ = ~uVar67 & (uint)fVar101;
  auVar139 = auVar139 | auVar264;
  uVar64 = -(uint)(fVar135 <= ABS(fVar248));
  uVar65 = -(uint)(fVar71 <= ABS(fVar256));
  uVar66 = -(uint)(fVar100 <= ABS(fVar258));
  uVar67 = -(uint)(fVar101 <= ABS(fVar260));
  auVar250._0_4_ = (uint)fVar248 & uVar64;
  auVar250._4_4_ = (uint)fVar256 & uVar65;
  auVar250._8_4_ = (uint)fVar258 & uVar66;
  auVar250._12_4_ = (uint)fVar260 & uVar67;
  auVar199._0_4_ = ~uVar64 & (uint)fVar135;
  auVar199._4_4_ = ~uVar65 & (uint)fVar71;
  auVar199._8_4_ = ~uVar66 & (uint)fVar100;
  auVar199._12_4_ = ~uVar67 & (uint)fVar101;
  auVar199 = auVar199 | auVar250;
  uVar64 = -(uint)(fVar135 <= ABS(fVar173));
  uVar65 = -(uint)(fVar71 <= ABS(fVar196));
  uVar66 = -(uint)(fVar100 <= ABS(fVar197));
  uVar67 = -(uint)(fVar101 <= ABS(fVar128));
  auVar189._0_4_ = (uint)fVar173 & uVar64;
  auVar189._4_4_ = (uint)fVar196 & uVar65;
  auVar189._8_4_ = (uint)fVar197 & uVar66;
  auVar189._12_4_ = (uint)fVar128 & uVar67;
  auVar206._0_4_ = ~uVar64 & (uint)fVar135;
  auVar206._4_4_ = ~uVar65 & (uint)fVar71;
  auVar206._8_4_ = ~uVar66 & (uint)fVar100;
  auVar206._12_4_ = ~uVar67 & (uint)fVar101;
  auVar206 = auVar206 | auVar189;
  auVar72 = rcpps(_DAT_01f80d30,auVar139);
  fVar135 = auVar72._0_4_;
  fVar101 = auVar72._4_4_;
  fVar156 = auVar72._8_4_;
  fVar204 = auVar72._12_4_;
  fVar135 = (1.0 - auVar139._0_4_ * fVar135) * fVar135 + fVar135;
  fVar101 = (1.0 - auVar139._4_4_ * fVar101) * fVar101 + fVar101;
  fVar156 = (1.0 - auVar139._8_4_ * fVar156) * fVar156 + fVar156;
  fVar204 = (1.0 - auVar139._12_4_ * fVar204) * fVar204 + fVar204;
  auVar72 = rcpps(auVar72,auVar199);
  fVar71 = auVar72._0_4_;
  fVar103 = auVar72._4_4_;
  fVar168 = auVar72._8_4_;
  fVar212 = auVar72._12_4_;
  fVar71 = (1.0 - auVar199._0_4_ * fVar71) * fVar71 + fVar71;
  fVar103 = (1.0 - auVar199._4_4_ * fVar103) * fVar103 + fVar103;
  fVar168 = (1.0 - auVar199._8_4_ * fVar168) * fVar168 + fVar168;
  fVar212 = (1.0 - auVar199._12_4_ * fVar212) * fVar212 + fVar212;
  auVar72 = rcpps(auVar72,auVar206);
  fVar100 = auVar72._0_4_;
  fVar126 = auVar72._4_4_;
  fVar170 = auVar72._8_4_;
  fVar214 = auVar72._12_4_;
  fVar100 = (1.0 - auVar206._0_4_ * fVar100) * fVar100 + fVar100;
  fVar126 = (1.0 - auVar206._4_4_ * fVar126) * fVar126 + fVar126;
  fVar170 = (1.0 - auVar206._8_4_ * fVar170) * fVar170 + fVar170;
  fVar214 = (1.0 - auVar206._12_4_ * fVar214) * fVar214 + fVar214;
  fVar240 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar23 + 0x16)) *
            *(float *)(prim + lVar23 + 0x1a);
  uVar60 = *(ulong *)(prim + uVar51 * 7 + 6);
  uVar99 = (undefined2)(uVar60 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar60;
  auVar75._12_2_ = uVar99;
  auVar75._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar60 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar60;
  auVar74._10_2_ = uVar99;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar99;
  auVar73._0_8_ = uVar60;
  uVar99 = (undefined2)(uVar60 >> 0x10);
  auVar34._4_8_ = auVar73._8_8_;
  auVar34._2_2_ = uVar99;
  auVar34._0_2_ = uVar99;
  fVar127 = (float)(auVar34._0_4_ >> 0x10);
  fVar173 = (float)(auVar73._8_4_ >> 0x10);
  uVar62 = *(ulong *)(prim + uVar51 * 0xb + 6);
  uVar99 = (undefined2)(uVar62 >> 0x30);
  auVar142._8_4_ = 0;
  auVar142._0_8_ = uVar62;
  auVar142._12_2_ = uVar99;
  auVar142._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar62 >> 0x20);
  auVar141._12_4_ = auVar142._12_4_;
  auVar141._8_2_ = 0;
  auVar141._0_8_ = uVar62;
  auVar141._10_2_ = uVar99;
  auVar140._10_6_ = auVar141._10_6_;
  auVar140._8_2_ = uVar99;
  auVar140._0_8_ = uVar62;
  uVar99 = (undefined2)(uVar62 >> 0x10);
  auVar35._4_8_ = auVar140._8_8_;
  auVar35._2_2_ = uVar99;
  auVar35._0_2_ = uVar99;
  uVar9 = *(ulong *)(prim + uVar51 * 9 + 6);
  uVar99 = (undefined2)(uVar9 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar9;
  auVar78._12_2_ = uVar99;
  auVar78._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar9 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar9;
  auVar77._10_2_ = uVar99;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar99;
  auVar76._0_8_ = uVar9;
  uVar99 = (undefined2)(uVar9 >> 0x10);
  auVar36._4_8_ = auVar76._8_8_;
  auVar36._2_2_ = uVar99;
  auVar36._0_2_ = uVar99;
  fVar128 = (float)(auVar36._0_4_ >> 0x10);
  fVar196 = (float)(auVar76._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar51 * 0xd + 6);
  uVar99 = (undefined2)(uVar10 >> 0x30);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar10;
  auVar209._12_2_ = uVar99;
  auVar209._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar10 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar10;
  auVar208._10_2_ = uVar99;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar99;
  auVar207._0_8_ = uVar10;
  uVar99 = (undefined2)(uVar10 >> 0x10);
  auVar37._4_8_ = auVar207._8_8_;
  auVar37._2_2_ = uVar99;
  auVar37._0_2_ = uVar99;
  uVar11 = *(ulong *)(prim + uVar51 * 0x12 + 6);
  uVar99 = (undefined2)(uVar11 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar11;
  auVar81._12_2_ = uVar99;
  auVar81._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar11 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar11;
  auVar80._10_2_ = uVar99;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar99;
  auVar79._0_8_ = uVar11;
  uVar99 = (undefined2)(uVar11 >> 0x10);
  auVar38._4_8_ = auVar79._8_8_;
  auVar38._2_2_ = uVar99;
  auVar38._0_2_ = uVar99;
  fVar134 = (float)(auVar38._0_4_ >> 0x10);
  fVar197 = (float)(auVar79._8_4_ >> 0x10);
  uVar58 = (ulong)(uint)((int)(uVar51 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar51 * 2 + uVar58 + 6);
  uVar99 = (undefined2)(uVar12 >> 0x30);
  auVar224._8_4_ = 0;
  auVar224._0_8_ = uVar12;
  auVar224._12_2_ = uVar99;
  auVar224._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar12 >> 0x20);
  auVar223._12_4_ = auVar224._12_4_;
  auVar223._8_2_ = 0;
  auVar223._0_8_ = uVar12;
  auVar223._10_2_ = uVar99;
  auVar222._10_6_ = auVar223._10_6_;
  auVar222._8_2_ = uVar99;
  auVar222._0_8_ = uVar12;
  uVar99 = (undefined2)(uVar12 >> 0x10);
  auVar39._4_8_ = auVar222._8_8_;
  auVar39._2_2_ = uVar99;
  auVar39._0_2_ = uVar99;
  uVar58 = *(ulong *)(prim + uVar58 + 6);
  uVar99 = (undefined2)(uVar58 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar58;
  auVar84._12_2_ = uVar99;
  auVar84._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar58 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar58;
  auVar83._10_2_ = uVar99;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar99;
  auVar82._0_8_ = uVar58;
  uVar99 = (undefined2)(uVar58 >> 0x10);
  auVar40._4_8_ = auVar82._8_8_;
  auVar40._2_2_ = uVar99;
  auVar40._0_2_ = uVar99;
  fVar136 = (float)(auVar40._0_4_ >> 0x10);
  fVar198 = (float)(auVar82._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar51 * 0x18 + 6);
  uVar99 = (undefined2)(uVar13 >> 0x30);
  auVar235._8_4_ = 0;
  auVar235._0_8_ = uVar13;
  auVar235._12_2_ = uVar99;
  auVar235._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar13 >> 0x20);
  auVar234._12_4_ = auVar235._12_4_;
  auVar234._8_2_ = 0;
  auVar234._0_8_ = uVar13;
  auVar234._10_2_ = uVar99;
  auVar233._10_6_ = auVar234._10_6_;
  auVar233._8_2_ = uVar99;
  auVar233._0_8_ = uVar13;
  uVar99 = (undefined2)(uVar13 >> 0x10);
  auVar41._4_8_ = auVar233._8_8_;
  auVar41._2_2_ = uVar99;
  auVar41._0_2_ = uVar99;
  uVar14 = *(ulong *)(prim + uVar51 * 0x1d + 6);
  uVar99 = (undefined2)(uVar14 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar14;
  auVar87._12_2_ = uVar99;
  auVar87._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar14 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar14;
  auVar86._10_2_ = uVar99;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar99;
  auVar85._0_8_ = uVar14;
  uVar99 = (undefined2)(uVar14 >> 0x10);
  auVar42._4_8_ = auVar85._8_8_;
  auVar42._2_2_ = uVar99;
  auVar42._0_2_ = uVar99;
  fVar148 = (float)(auVar42._0_4_ >> 0x10);
  fVar202 = (float)(auVar85._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar51 + (ulong)(byte)PVar17 * 0x20 + 6);
  uVar99 = (undefined2)(uVar15 >> 0x30);
  auVar253._8_4_ = 0;
  auVar253._0_8_ = uVar15;
  auVar253._12_2_ = uVar99;
  auVar253._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar15 >> 0x20);
  auVar252._12_4_ = auVar253._12_4_;
  auVar252._8_2_ = 0;
  auVar252._0_8_ = uVar15;
  auVar252._10_2_ = uVar99;
  auVar251._10_6_ = auVar252._10_6_;
  auVar251._8_2_ = uVar99;
  auVar251._0_8_ = uVar15;
  uVar99 = (undefined2)(uVar15 >> 0x10);
  auVar43._4_8_ = auVar251._8_8_;
  auVar43._2_2_ = uVar99;
  auVar43._0_2_ = uVar99;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar17 * 0x20 - uVar51) + 6);
  uVar99 = (undefined2)(uVar16 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar16;
  auVar90._12_2_ = uVar99;
  auVar90._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar16 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar16;
  auVar89._10_2_ = uVar99;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar99;
  auVar88._0_8_ = uVar16;
  uVar99 = (undefined2)(uVar16 >> 0x10);
  auVar44._4_8_ = auVar88._8_8_;
  auVar44._2_2_ = uVar99;
  auVar44._0_2_ = uVar99;
  fVar151 = (float)(auVar44._0_4_ >> 0x10);
  fVar203 = (float)(auVar88._8_4_ >> 0x10);
  uVar51 = *(ulong *)(prim + uVar51 * 0x23 + 6);
  uVar99 = (undefined2)(uVar51 >> 0x30);
  auVar267._8_4_ = 0;
  auVar267._0_8_ = uVar51;
  auVar267._12_2_ = uVar99;
  auVar267._14_2_ = uVar99;
  uVar99 = (undefined2)(uVar51 >> 0x20);
  auVar266._12_4_ = auVar267._12_4_;
  auVar266._8_2_ = 0;
  auVar266._0_8_ = uVar51;
  auVar266._10_2_ = uVar99;
  auVar265._10_6_ = auVar266._10_6_;
  auVar265._8_2_ = uVar99;
  auVar265._0_8_ = uVar51;
  uVar99 = (undefined2)(uVar51 >> 0x10);
  auVar45._4_8_ = auVar265._8_8_;
  auVar45._2_2_ = uVar99;
  auVar45._0_2_ = uVar99;
  auVar143._0_8_ =
       CONCAT44(((((float)(auVar35._0_4_ >> 0x10) - fVar127) * fVar240 + fVar127) - fVar282) *
                fVar101,((((float)(int)(short)uVar62 - (float)(int)(short)uVar60) * fVar240 +
                         (float)(int)(short)uVar60) - fVar276) * fVar135);
  auVar143._8_4_ =
       ((((float)(auVar140._8_4_ >> 0x10) - fVar173) * fVar240 + fVar173) - fVar283) * fVar156;
  auVar143._12_4_ =
       ((((float)(auVar141._12_4_ >> 0x10) - (float)(auVar74._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar74._12_4_ >> 0x10)) - fVar284) * fVar204;
  auVar210._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar240 + (float)(int)(short)uVar9
        ) - fVar276) * fVar135;
  auVar210._4_4_ =
       ((((float)(auVar37._0_4_ >> 0x10) - fVar128) * fVar240 + fVar128) - fVar282) * fVar101;
  auVar210._8_4_ =
       ((((float)(auVar207._8_4_ >> 0x10) - fVar196) * fVar240 + fVar196) - fVar283) * fVar156;
  auVar210._12_4_ =
       ((((float)(auVar208._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar284) * fVar204;
  auVar225._0_8_ =
       CONCAT44(((((float)(auVar39._0_4_ >> 0x10) - fVar134) * fVar240 + fVar134) - fVar228) *
                fVar103,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar240 +
                         (float)(int)(short)uVar11) - fVar221) * fVar71);
  auVar225._8_4_ =
       ((((float)(auVar222._8_4_ >> 0x10) - fVar197) * fVar240 + fVar197) - fVar229) * fVar168;
  auVar225._12_4_ =
       ((((float)(auVar223._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar275) * fVar212;
  auVar236._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar58) * fVar240 +
        (float)(int)(short)uVar58) - fVar221) * fVar71;
  auVar236._4_4_ =
       ((((float)(auVar41._0_4_ >> 0x10) - fVar136) * fVar240 + fVar136) - fVar228) * fVar103;
  auVar236._8_4_ =
       ((((float)(auVar233._8_4_ >> 0x10) - fVar198) * fVar240 + fVar198) - fVar229) * fVar168;
  auVar236._12_4_ =
       ((((float)(auVar234._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar275) * fVar212;
  uVar55 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar254._0_8_ =
       CONCAT44(((((float)(auVar43._0_4_ >> 0x10) - fVar148) * fVar240 + fVar148) - fVar219) *
                fVar126,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar240 +
                         (float)(int)(short)uVar14) - fVar217) * fVar100);
  auVar254._8_4_ =
       ((((float)(auVar251._8_4_ >> 0x10) - fVar202) * fVar240 + fVar202) - fVar220) * fVar170;
  auVar254._12_4_ =
       ((((float)(auVar252._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar230) * fVar214;
  auVar268._0_4_ =
       ((((float)(int)(short)uVar51 - (float)(int)(short)uVar16) * fVar240 +
        (float)(int)(short)uVar16) - fVar217) * fVar100;
  auVar268._4_4_ =
       ((((float)(auVar45._0_4_ >> 0x10) - fVar151) * fVar240 + fVar151) - fVar219) * fVar126;
  auVar268._8_4_ =
       ((((float)(auVar265._8_4_ >> 0x10) - fVar203) * fVar240 + fVar203) - fVar220) * fVar170;
  auVar268._12_4_ =
       ((((float)(auVar266._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar240 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar230) * fVar214;
  auVar129._8_4_ = auVar143._8_4_;
  auVar129._0_8_ = auVar143._0_8_;
  auVar129._12_4_ = auVar143._12_4_;
  auVar130 = minps(auVar129,auVar210);
  auVar113._8_4_ = auVar225._8_4_;
  auVar113._0_8_ = auVar225._0_8_;
  auVar113._12_4_ = auVar225._12_4_;
  auVar72 = minps(auVar113,auVar236);
  auVar130 = maxps(auVar130,auVar72);
  auVar114._8_4_ = auVar254._8_4_;
  auVar114._0_8_ = auVar254._0_8_;
  auVar114._12_4_ = auVar254._12_4_;
  auVar72 = minps(auVar114,auVar268);
  auVar91._4_4_ = uVar55;
  auVar91._0_4_ = uVar55;
  auVar91._8_4_ = uVar55;
  auVar91._12_4_ = uVar55;
  auVar72 = maxps(auVar72,auVar91);
  auVar72 = maxps(auVar130,auVar72);
  auVar130 = maxps(auVar143,auVar210);
  auVar226 = maxps(auVar225,auVar236);
  auVar130 = minps(auVar130,auVar226);
  local_48 = auVar72._0_4_ * 0.99999964;
  fStack_44 = auVar72._4_4_ * 0.99999964;
  fStack_40 = auVar72._8_4_ * 0.99999964;
  fStack_3c = auVar72._12_4_ * 0.99999964;
  auVar72 = maxps(auVar254,auVar268);
  uVar55 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar92._4_4_ = uVar55;
  auVar92._0_4_ = uVar55;
  auVar92._8_4_ = uVar55;
  auVar92._12_4_ = uVar55;
  auVar72 = minps(auVar72,auVar92);
  auVar72 = minps(auVar130,auVar72);
  uVar64 = (uint)(byte)PVar17;
  auVar115._0_4_ = -(uint)(uVar64 != 0 && local_48 <= auVar72._0_4_ * 1.0000004);
  auVar115._4_4_ = -(uint)(1 < uVar64 && fStack_44 <= auVar72._4_4_ * 1.0000004);
  auVar115._8_4_ = -(uint)(2 < uVar64 && fStack_40 <= auVar72._8_4_ * 1.0000004);
  auVar115._12_4_ = -(uint)(3 < uVar64 && fStack_3c <= auVar72._12_4_ * 1.0000004);
  uVar64 = movmskps(uVar64,auVar115);
  if (uVar64 != 0) {
    uVar64 = uVar64 & 0xff;
    local_228 = pre->ray_space + k;
    local_3c8 = mm_lookupmask_ps._0_8_;
    uStack_3c0 = mm_lookupmask_ps._8_8_;
    local_308 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_300 = pre;
    local_220 = prim;
    do {
      lVar23 = 0;
      if (uVar64 != 0) {
        for (; (uVar64 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
        }
      }
      local_3d0 = (ulong)*(uint *)(local_220 + 2);
      local_2b8 = (ulong)*(uint *)(local_220 + lVar23 * 4 + 6);
      pGVar19 = (context->scene->geometries).items[local_3d0].ptr;
      uVar60 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                               local_2b8 *
                               pGVar19[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar135 = pGVar19->fnumTimeSegments;
      fVar71 = (pGVar19->time_range).lower;
      fVar100 = ((*(float *)(ray + k * 4 + 0x70) - fVar71) / ((pGVar19->time_range).upper - fVar71))
                * fVar135;
      fVar71 = floorf(fVar100);
      fVar135 = fVar135 + -1.0;
      if (fVar135 <= fVar71) {
        fVar71 = fVar135;
      }
      fVar135 = 0.0;
      if (0.0 <= fVar71) {
        fVar135 = fVar71;
      }
      _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar52 = (long)(int)fVar135 * 0x38;
      lVar63 = *(long *)(_Var20 + 0x10 + lVar52);
      lVar21 = *(long *)(_Var20 + 0x38 + lVar52);
      lVar22 = *(long *)(_Var20 + 0x48 + lVar52);
      pfVar1 = (float *)(lVar21 + lVar22 * uVar60);
      lVar23 = uVar60 + 1;
      pfVar2 = (float *)(lVar21 + lVar22 * lVar23);
      p_Var53 = pGVar19[4].occlusionFilterN;
      pfVar3 = (float *)(*(long *)(_Var20 + lVar52) + lVar63 * uVar60);
      pfVar4 = (float *)(*(long *)(_Var20 + lVar52) + lVar63 * lVar23);
      pfVar5 = (float *)(*(long *)(p_Var53 + lVar52 + 0x38) +
                        uVar60 * *(long *)(p_Var53 + lVar52 + 0x48));
      fVar100 = fVar100 - fVar135;
      fVar103 = 1.0 - fVar100;
      pGVar59 = (Geometry *)(*(long *)(p_Var53 + lVar52 + 0x48) * lVar23);
      pfVar6 = (float *)((long)&(pGVar59->super_RefCount)._vptr_RefCount +
                        *(long *)(p_Var53 + lVar52 + 0x38));
      local_368 = *pfVar3 * fVar103 + *pfVar1 * fVar100;
      fStack_364 = pfVar3[1] * fVar103 + pfVar1[1] * fVar100;
      fStack_360 = pfVar3[2] * fVar103 + pfVar1[2] * fVar100;
      fStack_35c = pfVar3[3] * fVar103 + pfVar1[3] * fVar100;
      pfVar1 = (float *)(*(long *)(p_Var53 + lVar52) + *(long *)(p_Var53 + lVar52 + 0x10) * uVar60);
      local_288 = *pfVar4 * fVar103 + *pfVar2 * fVar100;
      fStack_284 = pfVar4[1] * fVar103 + pfVar2[1] * fVar100;
      fStack_280 = pfVar4[2] * fVar103 + pfVar2[2] * fVar100;
      fStack_27c = pfVar4[3] * fVar103 + pfVar2[3] * fVar100;
      pfVar2 = (float *)(*(long *)(p_Var53 + lVar52) + *(long *)(p_Var53 + lVar52 + 0x10) * lVar23);
      iVar18 = (int)pGVar19[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar135 = *(float *)(ray + k * 4);
      fVar71 = *(float *)(ray + k * 4 + 0x10);
      fVar101 = *(float *)(ray + k * 4 + 0x20);
      local_298 = (*pfVar1 * fVar103 + *pfVar5 * fVar100) * 0.33333334 + local_368;
      fStack_294 = (pfVar1[1] * fVar103 + pfVar5[1] * fVar100) * 0.33333334 + fStack_364;
      fStack_290 = (pfVar1[2] * fVar103 + pfVar5[2] * fVar100) * 0.33333334 + fStack_360;
      fStack_28c = (pfVar1[3] * fVar103 + pfVar5[3] * fVar100) * 0.33333334 + fStack_35c;
      local_2a8 = local_288 - (fVar103 * *pfVar2 + fVar100 * *pfVar6) * 0.33333334;
      fStack_2a4 = fStack_284 - (fVar103 * pfVar2[1] + fVar100 * pfVar6[1]) * 0.33333334;
      fStack_2a0 = fStack_280 - (fVar103 * pfVar2[2] + fVar100 * pfVar6[2]) * 0.33333334;
      fStack_29c = fStack_27c - (fVar103 * pfVar2[3] + fVar100 * pfVar6[3]) * 0.33333334;
      fVar156 = local_368 - fVar135;
      fVar168 = fStack_364 - fVar71;
      fVar170 = fStack_360 - fVar101;
      fVar100 = (local_228->vx).field_0.m128[0];
      fVar103 = (local_228->vx).field_0.m128[1];
      fVar126 = (local_228->vx).field_0.m128[2];
      fVar127 = (local_228->vy).field_0.m128[0];
      fVar128 = (local_228->vy).field_0.m128[1];
      fVar134 = (local_228->vy).field_0.m128[2];
      fVar136 = (local_228->vz).field_0.m128[0];
      fVar148 = (local_228->vz).field_0.m128[1];
      fVar151 = (local_228->vz).field_0.m128[2];
      local_1d8 = fVar156 * fVar100 + fVar168 * fVar127 + fVar170 * fVar136;
      local_238 = fVar156 * fVar103 + fVar168 * fVar128 + fVar170 * fVar148;
      fVar197 = fVar156 * fVar126 + fVar168 * fVar134 + fVar170 * fVar151;
      fVar156 = local_298 - fVar135;
      fVar168 = fStack_294 - fVar71;
      fVar170 = fStack_290 - fVar101;
      fVar173 = fVar156 * fVar100 + fVar168 * fVar127 + fVar170 * fVar136;
      fVar196 = fVar156 * fVar103 + fVar168 * fVar128 + fVar170 * fVar148;
      local_338 = fVar156 * fVar126 + fVar168 * fVar134 + fVar170 * fVar151;
      fVar156 = local_2a8 - fVar135;
      fVar168 = fStack_2a4 - fVar71;
      fVar170 = fStack_2a0 - fVar101;
      fVar198 = fVar156 * fVar100 + fVar168 * fVar127 + fVar170 * fVar136;
      local_318 = fVar156 * fVar103 + fVar168 * fVar128 + fVar170 * fVar148;
      local_348 = fVar156 * fVar126 + fVar168 * fVar134 + fVar170 * fVar151;
      fVar135 = local_288 - fVar135;
      fVar71 = fStack_284 - fVar71;
      fVar101 = fStack_280 - fVar101;
      fVar100 = fVar135 * fVar100 + fVar71 * fVar127 + fVar101 * fVar136;
      local_328 = fVar135 * fVar103 + fVar71 * fVar128 + fVar101 * fVar148;
      local_358 = fVar135 * fVar126 + fVar71 * fVar134 + fVar101 * fVar151;
      auVar237._0_8_ = CONCAT44(local_238,local_1d8) & 0x7fffffff7fffffff;
      auVar237._8_4_ = ABS(fVar197);
      auVar237._12_4_ = ABS(fStack_35c);
      auVar158._0_8_ = CONCAT44(fVar196,fVar173) & 0x7fffffff7fffffff;
      auVar158._8_4_ = ABS(local_338);
      auVar158._12_4_ = ABS(fStack_28c);
      auVar130 = maxps(auVar237,auVar158);
      auVar190._0_8_ = CONCAT44(local_318,fVar198) & 0x7fffffff7fffffff;
      auVar190._8_4_ = ABS(local_348);
      auVar190._12_4_ = ABS(fStack_29c);
      auVar116._0_8_ = CONCAT44(local_328,fVar100) & 0x7fffffff7fffffff;
      auVar116._8_4_ = ABS(local_358);
      auVar116._12_4_ = ABS(fStack_27c);
      auVar72 = maxps(auVar190,auVar116);
      auVar72 = maxps(auVar130,auVar72);
      uVar102 = auVar72._8_8_;
      fVar135 = auVar72._4_4_;
      if (auVar72._4_4_ <= auVar72._0_4_) {
        fVar135 = auVar72._0_4_;
      }
      auVar238._8_8_ = uVar102;
      auVar238._0_8_ = uVar102;
      fVar71 = (float)iVar18;
      local_2c8 = ZEXT416((uint)fVar71);
      if (auVar72._8_4_ <= fVar135) {
        auVar239._4_12_ = auVar238._4_12_;
        auVar239._0_4_ = fVar135;
        uVar102 = auVar239._0_8_;
      }
      pRVar56 = (RTCIntersectArguments *)((long)iVar18 * 0x40);
      lVar23 = (long)iVar18 * 0x44;
      fVar101 = *(float *)(bezier_basis0 + lVar23 + 0x908);
      fVar103 = *(float *)(bezier_basis0 + lVar23 + 0x90c);
      fVar126 = *(float *)(bezier_basis0 + lVar23 + 0x910);
      fVar127 = *(float *)(bezier_basis0 + lVar23 + 0x914);
      pauVar8 = (undefined1 (*) [16])(bezier_basis0 + lVar23 + 0xd8c);
      fVar135 = *(float *)*pauVar8;
      fVar128 = *(float *)(bezier_basis0 + lVar23 + 0xd90);
      fVar134 = *(float *)(bezier_basis0 + lVar23 + 0xd94);
      auVar25 = *(undefined1 (*) [12])*pauVar8;
      fVar136 = *(float *)(bezier_basis0 + lVar23 + 0xd98);
      _local_388 = *pauVar8;
      local_3a8 = *(float *)(bezier_basis0 + lVar23 + 0x484);
      fStack_3a4 = *(float *)(bezier_basis0 + lVar23 + 0x488);
      fStack_3a0 = *(float *)(bezier_basis0 + lVar23 + 0x48c);
      fStack_39c = *(float *)(bezier_basis0 + lVar23 + 0x490);
      local_248 = *(float *)(bezier_basis0 + lVar23);
      fStack_244 = *(float *)(bezier_basis0 + lVar23 + 4);
      fStack_240 = *(float *)(bezier_basis0 + lVar23 + 8);
      fStack_23c = *(float *)(bezier_basis0 + lVar23 + 0xc);
      local_378 = local_1d8 * local_248 +
                  fVar173 * local_3a8 + fVar198 * fVar101 + fVar100 * fVar135;
      fStack_374 = local_1d8 * fStack_244 +
                   fVar173 * fStack_3a4 + fVar198 * fVar103 + fVar100 * fVar128;
      fStack_370 = local_1d8 * fStack_240 +
                   fVar173 * fStack_3a0 + fVar198 * fVar126 + fVar100 * fVar134;
      fStack_36c = local_1d8 * fStack_23c +
                   fVar173 * fStack_39c + fVar198 * fVar127 + fVar100 * fVar136;
      local_398 = local_238 * local_248 +
                  fVar196 * local_3a8 + local_318 * fVar101 + local_328 * fVar135;
      fStack_394 = local_238 * fStack_244 +
                   fVar196 * fStack_3a4 + local_318 * fVar103 + local_328 * fVar128;
      fStack_390 = local_238 * fStack_240 +
                   fVar196 * fStack_3a0 + local_318 * fVar126 + local_328 * fVar134;
      fStack_38c = local_238 * fStack_23c +
                   fVar196 * fStack_39c + local_318 * fVar127 + local_328 * fVar136;
      auVar191._0_4_ =
           fStack_35c * local_248 +
           fStack_28c * local_3a8 + fStack_29c * fVar101 + fStack_27c * fVar135;
      auVar191._4_4_ =
           fStack_35c * fStack_244 +
           fStack_28c * fStack_3a4 + fStack_29c * fVar103 + fStack_27c * fVar128;
      auVar191._8_4_ =
           fStack_35c * fStack_240 +
           fStack_28c * fStack_3a0 + fStack_29c * fVar126 + fStack_27c * fVar134;
      auVar191._12_4_ =
           fStack_35c * fStack_23c +
           fStack_28c * fStack_39c + fStack_29c * fVar127 + fStack_27c * fVar136;
      fVar128 = *(float *)(bezier_basis1 + lVar23 + 0xd8c);
      fVar134 = *(float *)(bezier_basis1 + lVar23 + 0xd90);
      fVar148 = *(float *)(bezier_basis1 + lVar23 + 0xd94);
      fVar151 = *(float *)(bezier_basis1 + lVar23 + 0xd98);
      pauVar8 = (undefined1 (*) [16])(bezier_basis1 + lVar23 + 0x908);
      fVar135 = *(float *)*pauVar8;
      fVar156 = *(float *)(bezier_basis1 + lVar23 + 0x90c);
      fVar168 = *(float *)(bezier_basis1 + lVar23 + 0x910);
      auVar26 = *(undefined1 (*) [12])*pauVar8;
      fVar170 = *(float *)(bezier_basis1 + lVar23 + 0x914);
      _local_258 = *pauVar8;
      fVar202 = *(float *)(bezier_basis1 + lVar23 + 0x484);
      fVar203 = *(float *)(bezier_basis1 + lVar23 + 0x488);
      fVar204 = *(float *)(bezier_basis1 + lVar23 + 0x48c);
      fVar212 = *(float *)(bezier_basis1 + lVar23 + 0x490);
      fVar214 = *(float *)(bezier_basis1 + lVar23);
      fVar221 = *(float *)(bezier_basis1 + lVar23 + 4);
      fVar228 = *(float *)(bezier_basis1 + lVar23 + 8);
      fVar229 = *(float *)(bezier_basis1 + lVar23 + 0xc);
      fVar260 = local_1d8 * fVar214 + fVar173 * fVar202 + fVar198 * fVar135 + fVar100 * fVar128;
      fVar262 = local_1d8 * fVar221 + fVar173 * fVar203 + fVar198 * fVar156 + fVar100 * fVar134;
      fVar272 = local_1d8 * fVar228 + fVar173 * fVar204 + fVar198 * fVar168 + fVar100 * fVar148;
      fVar273 = local_1d8 * fVar229 + fVar173 * fVar212 + fVar198 * fVar170 + fVar100 * fVar151;
      fVar243 = local_238 * fVar214 + fVar196 * fVar202 + local_318 * fVar135 + local_328 * fVar128;
      fVar248 = local_238 * fVar221 + fVar196 * fVar203 + local_318 * fVar156 + local_328 * fVar134;
      fVar256 = local_238 * fVar228 + fVar196 * fVar204 + local_318 * fVar168 + local_328 * fVar148;
      fVar258 = local_238 * fVar229 + fVar196 * fVar212 + local_318 * fVar170 + local_328 * fVar151;
      auVar269._0_4_ =
           fStack_35c * fVar214 + fStack_28c * fVar202 + fStack_29c * fVar135 + fStack_27c * fVar128
      ;
      auVar269._4_4_ =
           fStack_35c * fVar221 + fStack_28c * fVar203 + fStack_29c * fVar156 + fStack_27c * fVar134
      ;
      auVar269._8_4_ =
           fStack_35c * fVar228 + fStack_28c * fVar204 + fStack_29c * fVar168 + fStack_27c * fVar148
      ;
      auVar269._12_4_ =
           fStack_35c * fVar229 + fStack_28c * fVar212 + fStack_29c * fVar170 + fStack_27c * fVar151
      ;
      fVar219 = fVar260 - local_378;
      fVar220 = fVar262 - fStack_374;
      fVar230 = fVar272 - fStack_370;
      fVar240 = fVar273 - fStack_36c;
      fVar156 = fVar243 - local_398;
      fVar168 = fVar248 - fStack_394;
      fVar275 = fVar256 - fStack_390;
      fVar217 = fVar258 - fStack_38c;
      fVar135 = local_398 * fVar219 - local_378 * fVar156;
      fVar274 = fStack_394 * fVar220 - fStack_374 * fVar168;
      fVar276 = fStack_390 * fVar230 - fStack_370 * fVar275;
      fVar282 = fStack_38c * fVar240 - fStack_36c * fVar217;
      auVar72 = maxps(auVar191,auVar269);
      bVar47 = fVar135 * fVar135 <=
               auVar72._0_4_ * auVar72._0_4_ * (fVar219 * fVar219 + fVar156 * fVar156) &&
               0.0 < fVar71;
      auVar289._0_4_ = -(uint)bVar47;
      bVar48 = fVar274 * fVar274 <=
               auVar72._4_4_ * auVar72._4_4_ * (fVar220 * fVar220 + fVar168 * fVar168) &&
               1.0 < fVar71;
      auVar289._4_4_ = -(uint)bVar48;
      bVar46 = fVar276 * fVar276 <=
               auVar72._8_4_ * auVar72._8_4_ * (fVar230 * fVar230 + fVar275 * fVar275) &&
               2.0 < fVar71;
      auVar289._8_4_ = -(uint)bVar46;
      bVar61 = 3.0 < fVar71 &&
               fVar282 * fVar282 <=
               auVar72._12_4_ * auVar72._12_4_ * (fVar240 * fVar240 + fVar217 * fVar217);
      auVar289._12_4_ = -(uint)bVar61;
      local_418 = (float)uVar102;
      local_418 = local_418 * 4.7683716e-07;
      iVar50 = movmskps(iVar18,auVar289);
      fVar135 = *(float *)(ray + k * 4 + 0x30);
      _local_3b8 = ZEXT416((uint)fVar135);
      fStack_354 = local_358;
      fStack_350 = local_358;
      fStack_34c = local_358;
      fStack_344 = local_348;
      fStack_340 = local_348;
      fStack_33c = local_348;
      fStack_334 = local_338;
      fStack_330 = local_338;
      fStack_32c = local_338;
      fStack_324 = local_328;
      fStack_320 = local_328;
      fStack_31c = local_328;
      fStack_314 = local_318;
      fStack_310 = local_318;
      fStack_30c = local_318;
      fStack_234 = local_238;
      fStack_230 = local_238;
      fStack_22c = local_238;
      local_218 = fStack_35c;
      fStack_214 = fStack_35c;
      fStack_210 = fStack_35c;
      fStack_20c = fStack_35c;
      local_208 = fStack_28c;
      fStack_204 = fStack_28c;
      fStack_200 = fStack_28c;
      fStack_1fc = fStack_28c;
      local_1f8 = fStack_27c;
      fStack_1f4 = fStack_27c;
      fStack_1f0 = fStack_27c;
      fStack_1ec = fStack_27c;
      local_1e8 = fStack_29c;
      fStack_1e4 = fStack_29c;
      fStack_1e0 = fStack_29c;
      fStack_1dc = fStack_29c;
      fStack_1d4 = local_1d8;
      fStack_1d0 = local_1d8;
      fStack_1cc = local_1d8;
      if (iVar50 == 0) {
        bVar61 = false;
      }
      else {
        local_258._0_4_ = auVar26._0_4_;
        local_258._4_4_ = auVar26._4_4_;
        fStack_250 = auVar26._8_4_;
        fVar137 = fVar128 * local_358 + (float)local_258._0_4_ * local_348 + fVar202 * local_338 +
                  fVar214 * fVar197;
        fVar149 = fVar134 * local_358 + (float)local_258._4_4_ * local_348 + fVar203 * local_338 +
                  fVar221 * fVar197;
        fVar152 = fVar148 * local_358 + fStack_250 * local_348 + fVar204 * local_338 +
                  fVar228 * fVar197;
        fVar154 = fVar151 * local_358 + fVar170 * local_348 + fVar212 * local_338 +
                  fVar229 * fVar197;
        local_388._0_4_ = auVar25._0_4_;
        local_388._4_4_ = auVar25._4_4_;
        fStack_380 = auVar25._8_4_;
        fVar138 = (float)local_388._0_4_ * local_358 + fVar101 * local_348 + local_3a8 * local_338 +
                  local_248 * fVar197;
        fVar150 = (float)local_388._4_4_ * local_358 + fVar103 * local_348 + fStack_3a4 * local_338
                  + fStack_244 * fVar197;
        fVar153 = fStack_380 * local_358 + fVar126 * local_348 + fStack_3a0 * local_338 +
                  fStack_240 * fVar197;
        fVar155 = fVar136 * local_358 + fVar127 * local_348 + fStack_39c * local_338 +
                  fStack_23c * fVar197;
        fVar101 = *(float *)(bezier_basis0 + lVar23 + 0x1210);
        fVar103 = *(float *)(bezier_basis0 + lVar23 + 0x1214);
        fVar126 = *(float *)(bezier_basis0 + lVar23 + 0x1218);
        fVar127 = *(float *)(bezier_basis0 + lVar23 + 0x121c);
        fVar128 = *(float *)(bezier_basis0 + lVar23 + 0x1694);
        fVar134 = *(float *)(bezier_basis0 + lVar23 + 0x1698);
        fVar136 = *(float *)(bezier_basis0 + lVar23 + 0x169c);
        fVar148 = *(float *)(bezier_basis0 + lVar23 + 0x16a0);
        fVar151 = *(float *)(bezier_basis0 + lVar23 + 0x1b18);
        fVar170 = *(float *)(bezier_basis0 + lVar23 + 0x1b1c);
        fVar202 = *(float *)(bezier_basis0 + lVar23 + 0x1b20);
        fVar203 = *(float *)(bezier_basis0 + lVar23 + 0x1b24);
        fVar204 = *(float *)(bezier_basis0 + lVar23 + 0x1f9c);
        fVar212 = *(float *)(bezier_basis0 + lVar23 + 0x1fa0);
        fVar214 = *(float *)(bezier_basis0 + lVar23 + 0x1fa4);
        fVar221 = *(float *)(bezier_basis0 + lVar23 + 0x1fa8);
        fVar231 = local_1d8 * fVar101 + fVar173 * fVar128 + fVar198 * fVar151 + fVar100 * fVar204;
        fVar241 = local_1d8 * fVar103 + fVar173 * fVar134 + fVar198 * fVar170 + fVar100 * fVar212;
        fVar244 = local_1d8 * fVar126 + fVar173 * fVar136 + fVar198 * fVar202 + fVar100 * fVar214;
        fVar246 = local_1d8 * fVar127 + fVar173 * fVar148 + fVar198 * fVar203 + fVar100 * fVar221;
        fVar288 = local_238 * fVar101 +
                  fVar196 * fVar128 + local_318 * fVar151 + local_328 * fVar204;
        fVar290 = local_238 * fVar103 +
                  fVar196 * fVar134 + local_318 * fVar170 + local_328 * fVar212;
        fVar291 = local_238 * fVar126 +
                  fVar196 * fVar136 + local_318 * fVar202 + local_328 * fVar214;
        fVar292 = local_238 * fVar127 +
                  fVar196 * fVar148 + local_318 * fVar203 + local_328 * fVar221;
        fVar228 = *(float *)(bezier_basis1 + lVar23 + 0x1210);
        fVar229 = *(float *)(bezier_basis1 + lVar23 + 0x1214);
        fVar274 = *(float *)(bezier_basis1 + lVar23 + 0x1218);
        fVar276 = *(float *)(bezier_basis1 + lVar23 + 0x121c);
        fVar282 = *(float *)(bezier_basis1 + lVar23 + 0x1b18);
        fVar283 = *(float *)(bezier_basis1 + lVar23 + 0x1b1c);
        fVar284 = *(float *)(bezier_basis1 + lVar23 + 0x1b20);
        fVar263 = *(float *)(bezier_basis1 + lVar23 + 0x1b24);
        fVar232 = *(float *)(bezier_basis1 + lVar23 + 0x1f9c);
        fVar242 = *(float *)(bezier_basis1 + lVar23 + 0x1fa0);
        fVar245 = *(float *)(bezier_basis1 + lVar23 + 0x1fa4);
        fVar247 = *(float *)(bezier_basis1 + lVar23 + 0x1fa8);
        fVar249 = *(float *)(bezier_basis1 + lVar23 + 0x1694);
        fVar257 = *(float *)(bezier_basis1 + lVar23 + 0x1698);
        fVar259 = *(float *)(bezier_basis1 + lVar23 + 0x169c);
        fVar261 = *(float *)(bezier_basis1 + lVar23 + 0x16a0);
        fVar205 = local_1d8 * fVar228 + fVar173 * fVar249 + fVar198 * fVar282 + fVar100 * fVar232;
        fVar213 = local_1d8 * fVar229 + fVar173 * fVar257 + fVar198 * fVar283 + fVar100 * fVar242;
        fVar215 = local_1d8 * fVar274 + fVar173 * fVar259 + fVar198 * fVar284 + fVar100 * fVar245;
        fVar216 = local_1d8 * fVar276 + fVar173 * fVar261 + fVar198 * fVar263 + fVar100 * fVar247;
        fVar157 = local_238 * fVar228 +
                  fVar196 * fVar249 + local_318 * fVar282 + local_328 * fVar232;
        fVar169 = local_238 * fVar229 +
                  fVar196 * fVar257 + local_318 * fVar283 + local_328 * fVar242;
        fVar171 = local_238 * fVar274 +
                  fVar196 * fVar259 + local_318 * fVar284 + local_328 * fVar245;
        fVar172 = local_238 * fVar276 +
                  fVar196 * fVar261 + local_318 * fVar263 + local_328 * fVar247;
        auVar270._0_8_ = CONCAT44(fVar241,fVar231) & 0x7fffffff7fffffff;
        auVar270._8_4_ = ABS(fVar244);
        auVar270._12_4_ = ABS(fVar246);
        auVar218._0_8_ = CONCAT44(fVar290,fVar288) & 0x7fffffff7fffffff;
        auVar218._8_4_ = ABS(fVar291);
        auVar218._12_4_ = ABS(fVar292);
        auVar72 = maxps(auVar270,auVar218);
        auVar277._0_8_ =
             CONCAT44(fVar103 * fVar197 +
                      fVar134 * local_338 + fVar170 * local_348 + fVar212 * local_358,
                      fVar101 * fVar197 +
                      fVar128 * local_338 + fVar151 * local_348 + fVar204 * local_358) &
             0x7fffffff7fffffff;
        auVar277._8_4_ =
             ABS(fVar126 * fVar197 + fVar136 * local_338 + fVar202 * local_348 + fVar214 * local_358
                );
        auVar277._12_4_ =
             ABS(fVar127 * fVar197 + fVar148 * local_338 + fVar203 * local_348 + fVar221 * local_358
                );
        auVar72 = maxps(auVar72,auVar277);
        uVar65 = -(uint)(local_418 <= auVar72._0_4_);
        uVar66 = -(uint)(local_418 <= auVar72._4_4_);
        uVar67 = -(uint)(local_418 <= auVar72._8_4_);
        uVar68 = -(uint)(local_418 <= auVar72._12_4_);
        fVar134 = (float)((uint)fVar231 & uVar65 | ~uVar65 & (uint)fVar219);
        fVar148 = (float)((uint)fVar241 & uVar66 | ~uVar66 & (uint)fVar220);
        fVar202 = (float)((uint)fVar244 & uVar67 | ~uVar67 & (uint)fVar230);
        fVar203 = (float)((uint)fVar246 & uVar68 | ~uVar68 & (uint)fVar240);
        fVar204 = (float)(~uVar65 & (uint)fVar156 | (uint)fVar288 & uVar65);
        fVar212 = (float)(~uVar66 & (uint)fVar168 | (uint)fVar290 & uVar66);
        fVar214 = (float)(~uVar67 & (uint)fVar275 | (uint)fVar291 & uVar67);
        fVar221 = (float)(~uVar68 & (uint)fVar217 | (uint)fVar292 & uVar68);
        auVar278._0_8_ = CONCAT44(fVar213,fVar205) & 0x7fffffff7fffffff;
        auVar278._8_4_ = ABS(fVar215);
        auVar278._12_4_ = ABS(fVar216);
        auVar227._0_8_ = CONCAT44(fVar169,fVar157) & 0x7fffffff7fffffff;
        auVar227._8_4_ = ABS(fVar171);
        auVar227._12_4_ = ABS(fVar172);
        auVar72 = maxps(auVar278,auVar227);
        auVar200._0_8_ =
             CONCAT44(fVar229 * fVar197 +
                      fVar257 * local_338 + fVar283 * local_348 + fVar242 * local_358,
                      fVar228 * fVar197 +
                      fVar249 * local_338 + fVar282 * local_348 + fVar232 * local_358) &
             0x7fffffff7fffffff;
        auVar200._8_4_ =
             ABS(fVar274 * fVar197 + fVar259 * local_338 + fVar284 * local_348 + fVar245 * local_358
                );
        auVar200._12_4_ =
             ABS(fVar276 * fVar197 + fVar261 * local_338 + fVar263 * local_348 + fVar247 * local_358
                );
        auVar72 = maxps(auVar72,auVar200);
        uVar65 = -(uint)(local_418 <= auVar72._0_4_);
        uVar66 = -(uint)(local_418 <= auVar72._4_4_);
        uVar67 = -(uint)(local_418 <= auVar72._8_4_);
        uVar68 = -(uint)(local_418 <= auVar72._12_4_);
        fVar128 = (float)((uint)fVar205 & uVar65 | ~uVar65 & (uint)fVar219);
        fVar136 = (float)((uint)fVar213 & uVar66 | ~uVar66 & (uint)fVar220);
        fVar151 = (float)((uint)fVar215 & uVar67 | ~uVar67 & (uint)fVar230);
        fVar170 = (float)((uint)fVar216 & uVar68 | ~uVar68 & (uint)fVar240);
        auVar159._0_4_ = (uint)fVar157 & uVar65;
        auVar159._4_4_ = (uint)fVar169 & uVar66;
        auVar159._8_4_ = (uint)fVar171 & uVar67;
        auVar159._12_4_ = (uint)fVar172 & uVar68;
        auVar279._0_4_ = ~uVar65 & (uint)fVar156;
        auVar279._4_4_ = ~uVar66 & (uint)fVar168;
        auVar279._8_4_ = ~uVar67 & (uint)fVar275;
        auVar279._12_4_ = ~uVar68 & (uint)fVar217;
        auVar279 = auVar279 | auVar159;
        auVar117._0_4_ = fVar204 * fVar204 + fVar134 * fVar134;
        auVar117._4_4_ = fVar212 * fVar212 + fVar148 * fVar148;
        auVar117._8_4_ = fVar214 * fVar214 + fVar202 * fVar202;
        auVar117._12_4_ = fVar221 * fVar221 + fVar203 * fVar203;
        auVar72 = rsqrtps(auVar159,auVar117);
        fVar101 = auVar72._0_4_;
        fVar103 = auVar72._4_4_;
        fVar126 = auVar72._8_4_;
        fVar127 = auVar72._12_4_;
        auVar160._0_4_ = fVar101 * fVar101 * auVar117._0_4_ * 0.5 * fVar101;
        auVar160._4_4_ = fVar103 * fVar103 * auVar117._4_4_ * 0.5 * fVar103;
        auVar160._8_4_ = fVar126 * fVar126 * auVar117._8_4_ * 0.5 * fVar126;
        auVar160._12_4_ = fVar127 * fVar127 * auVar117._12_4_ * 0.5 * fVar127;
        fVar274 = fVar101 * 1.5 - auVar160._0_4_;
        fVar276 = fVar103 * 1.5 - auVar160._4_4_;
        fVar282 = fVar126 * 1.5 - auVar160._8_4_;
        fVar283 = fVar127 * 1.5 - auVar160._12_4_;
        fVar228 = auVar279._0_4_;
        fVar229 = auVar279._4_4_;
        fVar275 = auVar279._8_4_;
        fVar217 = auVar279._12_4_;
        auVar118._0_4_ = fVar228 * fVar228 + fVar128 * fVar128;
        auVar118._4_4_ = fVar229 * fVar229 + fVar136 * fVar136;
        auVar118._8_4_ = fVar275 * fVar275 + fVar151 * fVar151;
        auVar118._12_4_ = fVar217 * fVar217 + fVar170 * fVar170;
        auVar72 = rsqrtps(auVar160,auVar118);
        fVar101 = auVar72._0_4_;
        fVar103 = auVar72._4_4_;
        fVar126 = auVar72._8_4_;
        fVar127 = auVar72._12_4_;
        fVar101 = fVar101 * 1.5 - fVar101 * fVar101 * auVar118._0_4_ * 0.5 * fVar101;
        fVar156 = fVar103 * 1.5 - fVar103 * fVar103 * auVar118._4_4_ * 0.5 * fVar103;
        fVar126 = fVar126 * 1.5 - fVar126 * fVar126 * auVar118._8_4_ * 0.5 * fVar126;
        fVar168 = fVar127 * 1.5 - fVar127 * fVar127 * auVar118._12_4_ * 0.5 * fVar127;
        fVar263 = fVar204 * fVar274 * auVar191._0_4_;
        fVar169 = fVar212 * fVar276 * auVar191._4_4_;
        fVar172 = fVar214 * fVar282 * auVar191._8_4_;
        fVar213 = fVar221 * fVar283 * auVar191._12_4_;
        fVar103 = -fVar134 * fVar274 * auVar191._0_4_;
        fVar127 = -fVar148 * fVar276 * auVar191._4_4_;
        fVar134 = -fVar202 * fVar282 * auVar191._8_4_;
        fVar148 = -fVar203 * fVar283 * auVar191._12_4_;
        fVar246 = fVar274 * 0.0 * auVar191._0_4_;
        fVar288 = fVar276 * 0.0 * auVar191._4_4_;
        fVar290 = fVar282 * 0.0 * auVar191._8_4_;
        fVar291 = fVar283 * 0.0 * auVar191._12_4_;
        fVar216 = fVar228 * fVar101 * auVar269._0_4_;
        fVar231 = fVar229 * fVar156 * auVar269._4_4_;
        fVar241 = fVar275 * fVar126 * auVar269._8_4_;
        fVar244 = fVar217 * fVar168 * auVar269._12_4_;
        fVar232 = fVar260 + fVar216;
        fVar242 = fVar262 + fVar231;
        fVar245 = fVar272 + fVar241;
        fVar247 = fVar273 + fVar244;
        fVar275 = -fVar128 * fVar101 * auVar269._0_4_;
        fVar217 = -fVar136 * fVar156 * auVar269._4_4_;
        fVar283 = -fVar151 * fVar126 * auVar269._8_4_;
        fVar170 = -fVar170 * fVar168 * auVar269._12_4_;
        fVar249 = fVar243 + fVar275;
        fVar257 = fVar248 + fVar217;
        fVar259 = fVar256 + fVar283;
        fVar261 = fVar258 + fVar170;
        fVar203 = fVar101 * 0.0 * auVar269._0_4_;
        fVar212 = fVar156 * 0.0 * auVar269._4_4_;
        fVar221 = fVar126 * 0.0 * auVar269._8_4_;
        fVar229 = fVar168 * 0.0 * auVar269._12_4_;
        fVar274 = local_378 - fVar263;
        fVar276 = fStack_374 - fVar169;
        fVar282 = fStack_370 - fVar172;
        fVar284 = fStack_36c - fVar213;
        fVar157 = fVar137 + fVar203;
        fVar171 = fVar149 + fVar212;
        fVar205 = fVar152 + fVar221;
        fVar215 = fVar154 + fVar229;
        fVar101 = local_398 - fVar103;
        fVar126 = fStack_394 - fVar127;
        fVar128 = fStack_390 - fVar134;
        fVar136 = fStack_38c - fVar148;
        fVar202 = fVar138 - fVar246;
        fVar204 = fVar150 - fVar288;
        fVar214 = fVar153 - fVar290;
        fVar228 = fVar155 - fVar291;
        uVar65 = -(uint)(0.0 < (fVar101 * (fVar157 - fVar202) - fVar202 * (fVar249 - fVar101)) * 0.0
                               + (fVar202 * (fVar232 - fVar274) - (fVar157 - fVar202) * fVar274) *
                                 0.0 + ((fVar249 - fVar101) * fVar274 -
                                       (fVar232 - fVar274) * fVar101));
        uVar66 = -(uint)(0.0 < (fVar126 * (fVar171 - fVar204) - fVar204 * (fVar257 - fVar126)) * 0.0
                               + (fVar204 * (fVar242 - fVar276) - (fVar171 - fVar204) * fVar276) *
                                 0.0 + ((fVar257 - fVar126) * fVar276 -
                                       (fVar242 - fVar276) * fVar126));
        uVar67 = -(uint)(0.0 < (fVar128 * (fVar205 - fVar214) - fVar214 * (fVar259 - fVar128)) * 0.0
                               + (fVar214 * (fVar245 - fVar282) - (fVar205 - fVar214) * fVar282) *
                                 0.0 + ((fVar259 - fVar128) * fVar282 -
                                       (fVar245 - fVar282) * fVar128));
        uVar68 = -(uint)(0.0 < (fVar136 * (fVar215 - fVar228) - fVar228 * (fVar261 - fVar136)) * 0.0
                               + (fVar228 * (fVar247 - fVar284) - (fVar215 - fVar228) * fVar284) *
                                 0.0 + ((fVar261 - fVar136) * fVar284 -
                                       (fVar247 - fVar284) * fVar136));
        fVar260 = (float)((uint)(fVar260 - fVar216) & uVar65 | ~uVar65 & (uint)(local_378 + fVar263)
                         );
        fVar262 = (float)((uint)(fVar262 - fVar231) & uVar66 |
                         ~uVar66 & (uint)(fStack_374 + fVar169));
        fVar272 = (float)((uint)(fVar272 - fVar241) & uVar67 |
                         ~uVar67 & (uint)(fStack_370 + fVar172));
        fVar273 = (float)((uint)(fVar273 - fVar244) & uVar68 |
                         ~uVar68 & (uint)(fStack_36c + fVar213));
        fVar151 = (float)((uint)(fVar243 - fVar275) & uVar65 | ~uVar65 & (uint)(local_398 + fVar103)
                         );
        fVar156 = (float)((uint)(fVar248 - fVar217) & uVar66 |
                         ~uVar66 & (uint)(fStack_394 + fVar127));
        fVar168 = (float)((uint)(fVar256 - fVar283) & uVar67 |
                         ~uVar67 & (uint)(fStack_390 + fVar134));
        fVar170 = (float)((uint)(fVar258 - fVar170) & uVar68 |
                         ~uVar68 & (uint)(fStack_38c + fVar148));
        fVar275 = (float)((uint)(fVar137 - fVar203) & uVar65 | ~uVar65 & (uint)(fVar138 + fVar246));
        fVar217 = (float)((uint)(fVar149 - fVar212) & uVar66 | ~uVar66 & (uint)(fVar150 + fVar288));
        fVar243 = (float)((uint)(fVar152 - fVar221) & uVar67 | ~uVar67 & (uint)(fVar153 + fVar290));
        fVar248 = (float)((uint)(fVar154 - fVar229) & uVar68 | ~uVar68 & (uint)(fVar155 + fVar291));
        fVar256 = (float)((uint)fVar274 & uVar65 | ~uVar65 & (uint)fVar232);
        fVar258 = (float)((uint)fVar276 & uVar66 | ~uVar66 & (uint)fVar242);
        fVar283 = (float)((uint)fVar282 & uVar67 | ~uVar67 & (uint)fVar245);
        fVar263 = (float)((uint)fVar284 & uVar68 | ~uVar68 & (uint)fVar247);
        fVar103 = (float)((uint)fVar101 & uVar65 | ~uVar65 & (uint)fVar249);
        fVar127 = (float)((uint)fVar126 & uVar66 | ~uVar66 & (uint)fVar257);
        fVar134 = (float)((uint)fVar128 & uVar67 | ~uVar67 & (uint)fVar259);
        fVar148 = (float)((uint)fVar136 & uVar68 | ~uVar68 & (uint)fVar261);
        fVar203 = (float)((uint)fVar202 & uVar65 | ~uVar65 & (uint)fVar157);
        fVar212 = (float)((uint)fVar204 & uVar66 | ~uVar66 & (uint)fVar171);
        fVar221 = (float)((uint)fVar214 & uVar67 | ~uVar67 & (uint)fVar205);
        fVar229 = (float)((uint)fVar228 & uVar68 | ~uVar68 & (uint)fVar215);
        fVar274 = (float)((uint)fVar232 & uVar65 | ~uVar65 & (uint)fVar274) - fVar260;
        fVar276 = (float)((uint)fVar242 & uVar66 | ~uVar66 & (uint)fVar276) - fVar262;
        fVar282 = (float)((uint)fVar245 & uVar67 | ~uVar67 & (uint)fVar282) - fVar272;
        fVar284 = (float)((uint)fVar247 & uVar68 | ~uVar68 & (uint)fVar284) - fVar273;
        fVar232 = (float)((uint)fVar249 & uVar65 | ~uVar65 & (uint)fVar101) - fVar151;
        fVar242 = (float)((uint)fVar257 & uVar66 | ~uVar66 & (uint)fVar126) - fVar156;
        fVar245 = (float)((uint)fVar259 & uVar67 | ~uVar67 & (uint)fVar128) - fVar168;
        fVar247 = (float)((uint)fVar261 & uVar68 | ~uVar68 & (uint)fVar136) - fVar170;
        fVar249 = (float)((uint)fVar157 & uVar65 | ~uVar65 & (uint)fVar202) - fVar275;
        fVar257 = (float)((uint)fVar171 & uVar66 | ~uVar66 & (uint)fVar204) - fVar217;
        fVar259 = (float)((uint)fVar205 & uVar67 | ~uVar67 & (uint)fVar214) - fVar243;
        fVar261 = (float)((uint)fVar215 & uVar68 | ~uVar68 & (uint)fVar228) - fVar248;
        fVar152 = fVar260 - fVar256;
        fVar153 = fVar262 - fVar258;
        fVar154 = fVar272 - fVar283;
        fVar155 = fVar273 - fVar263;
        fVar202 = fVar151 - fVar103;
        fVar204 = fVar156 - fVar127;
        fVar214 = fVar168 - fVar134;
        fVar228 = fVar170 - fVar148;
        fVar101 = fVar275 - fVar203;
        fVar126 = fVar217 - fVar212;
        fVar128 = fVar243 - fVar221;
        fVar136 = fVar248 - fVar229;
        fVar137 = (fVar151 * fVar249 - fVar275 * fVar232) * 0.0 +
                  (fVar275 * fVar274 - fVar260 * fVar249) * 0.0 +
                  (fVar260 * fVar232 - fVar151 * fVar274);
        fVar138 = (fVar156 * fVar257 - fVar217 * fVar242) * 0.0 +
                  (fVar217 * fVar276 - fVar262 * fVar257) * 0.0 +
                  (fVar262 * fVar242 - fVar156 * fVar276);
        auVar144._4_4_ = fVar138;
        auVar144._0_4_ = fVar137;
        fVar149 = (fVar168 * fVar259 - fVar243 * fVar245) * 0.0 +
                  (fVar243 * fVar282 - fVar272 * fVar259) * 0.0 +
                  (fVar272 * fVar245 - fVar168 * fVar282);
        fVar150 = (fVar170 * fVar261 - fVar248 * fVar247) * 0.0 +
                  (fVar248 * fVar284 - fVar273 * fVar261) * 0.0 +
                  (fVar273 * fVar247 - fVar170 * fVar284);
        auVar285._0_4_ =
             (fVar103 * fVar101 - fVar203 * fVar202) * 0.0 +
             (fVar203 * fVar152 - fVar256 * fVar101) * 0.0 + (fVar256 * fVar202 - fVar103 * fVar152)
        ;
        auVar285._4_4_ =
             (fVar127 * fVar126 - fVar212 * fVar204) * 0.0 +
             (fVar212 * fVar153 - fVar258 * fVar126) * 0.0 + (fVar258 * fVar204 - fVar127 * fVar153)
        ;
        auVar285._8_4_ =
             (fVar134 * fVar128 - fVar221 * fVar214) * 0.0 +
             (fVar221 * fVar154 - fVar283 * fVar128) * 0.0 + (fVar283 * fVar214 - fVar134 * fVar154)
        ;
        auVar285._12_4_ =
             (fVar148 * fVar136 - fVar229 * fVar228) * 0.0 +
             (fVar229 * fVar155 - fVar263 * fVar136) * 0.0 + (fVar263 * fVar228 - fVar148 * fVar155)
        ;
        auVar144._8_4_ = fVar149;
        auVar144._12_4_ = fVar150;
        auVar72 = maxps(auVar144,auVar285);
        bVar47 = auVar72._0_4_ <= 0.0 && bVar47;
        auVar145._0_4_ = -(uint)bVar47;
        bVar48 = auVar72._4_4_ <= 0.0 && bVar48;
        auVar145._4_4_ = -(uint)bVar48;
        bVar46 = auVar72._8_4_ <= 0.0 && bVar46;
        auVar145._8_4_ = -(uint)bVar46;
        bVar61 = auVar72._12_4_ <= 0.0 && bVar61;
        auVar145._12_4_ = -(uint)bVar61;
        iVar50 = movmskps(iVar50,auVar145);
        if (iVar50 == 0) {
          auVar93._8_8_ = uStack_3c0;
          auVar93._0_8_ = local_3c8;
          iVar50 = 0;
        }
        else {
          auVar161._0_4_ = fVar101 * fVar232;
          auVar161._4_4_ = fVar126 * fVar242;
          auVar161._8_4_ = fVar128 * fVar245;
          auVar161._12_4_ = fVar136 * fVar247;
          fVar203 = fVar202 * fVar249 - auVar161._0_4_;
          fVar212 = fVar204 * fVar257 - auVar161._4_4_;
          fVar221 = fVar214 * fVar259 - auVar161._8_4_;
          fVar229 = fVar228 * fVar261 - auVar161._12_4_;
          fVar101 = fVar101 * fVar274 - fVar249 * fVar152;
          fVar126 = fVar126 * fVar276 - fVar257 * fVar153;
          fVar128 = fVar128 * fVar282 - fVar259 * fVar154;
          fVar136 = fVar136 * fVar284 - fVar261 * fVar155;
          fVar202 = fVar152 * fVar232 - fVar202 * fVar274;
          fVar204 = fVar153 * fVar242 - fVar204 * fVar276;
          fVar214 = fVar154 * fVar245 - fVar214 * fVar282;
          fVar228 = fVar155 * fVar247 - fVar228 * fVar284;
          auVar192._0_4_ = fVar203 * 0.0 + fVar101 * 0.0 + fVar202;
          auVar192._4_4_ = fVar212 * 0.0 + fVar126 * 0.0 + fVar204;
          auVar192._8_4_ = fVar221 * 0.0 + fVar128 * 0.0 + fVar214;
          auVar192._12_4_ = fVar229 * 0.0 + fVar136 * 0.0 + fVar228;
          auVar72 = rcpps(auVar161,auVar192);
          fVar103 = auVar72._0_4_;
          fVar127 = auVar72._4_4_;
          fVar134 = auVar72._8_4_;
          fVar148 = auVar72._12_4_;
          fVar103 = (1.0 - auVar192._0_4_ * fVar103) * fVar103 + fVar103;
          fVar127 = (1.0 - auVar192._4_4_ * fVar127) * fVar127 + fVar127;
          fVar134 = (1.0 - auVar192._8_4_ * fVar134) * fVar134 + fVar134;
          fVar148 = (1.0 - auVar192._12_4_ * fVar148) * fVar148 + fVar148;
          fVar151 = (fVar275 * fVar202 + fVar151 * fVar101 + fVar260 * fVar203) * fVar103;
          fVar126 = (fVar217 * fVar204 + fVar156 * fVar126 + fVar262 * fVar212) * fVar127;
          fVar128 = (fVar243 * fVar214 + fVar168 * fVar128 + fVar272 * fVar221) * fVar134;
          fVar136 = (fVar248 * fVar228 + fVar170 * fVar136 + fVar273 * fVar229) * fVar148;
          fVar101 = *(float *)(ray + k * 4 + 0x80);
          bVar47 = (fVar135 <= fVar151 && fVar151 <= fVar101) && bVar47;
          auVar162._0_4_ = -(uint)bVar47;
          bVar48 = (fVar135 <= fVar126 && fVar126 <= fVar101) && bVar48;
          auVar162._4_4_ = -(uint)bVar48;
          bVar46 = (fVar135 <= fVar128 && fVar128 <= fVar101) && bVar46;
          auVar162._8_4_ = -(uint)bVar46;
          bVar61 = (fVar135 <= fVar136 && fVar136 <= fVar101) && bVar61;
          auVar162._12_4_ = -(uint)bVar61;
          iVar50 = movmskps(iVar50,auVar162);
          if (iVar50 == 0) {
            auVar93._8_8_ = uStack_3c0;
            auVar93._0_8_ = local_3c8;
            iVar50 = 0;
          }
          else {
            auVar163._0_8_ =
                 CONCAT44(-(uint)(auVar192._4_4_ != 0.0 && bVar48),
                          -(uint)(auVar192._0_4_ != 0.0 && bVar47));
            auVar163._8_4_ = -(uint)(auVar192._8_4_ != 0.0 && bVar46);
            auVar163._12_4_ = -(uint)(auVar192._12_4_ != 0.0 && bVar61);
            iVar50 = movmskps(iVar50,auVar163);
            auVar93._8_8_ = uStack_3c0;
            auVar93._0_8_ = local_3c8;
            if (iVar50 != 0) {
              fVar137 = fVar137 * fVar103;
              fVar138 = fVar138 * fVar127;
              fVar149 = fVar149 * fVar134;
              fVar150 = fVar150 * fVar148;
              local_3f8 = (float)((uint)(1.0 - fVar137) & uVar65 | ~uVar65 & (uint)fVar137);
              fStack_3f4 = (float)((uint)(1.0 - fVar138) & uVar66 | ~uVar66 & (uint)fVar138);
              fStack_3f0 = (float)((uint)(1.0 - fVar149) & uVar67 | ~uVar67 & (uint)fVar149);
              fStack_3ec = (float)((uint)(1.0 - fVar150) & uVar68 | ~uVar68 & (uint)fVar150);
              local_268 = (float)(~uVar65 & (uint)(auVar285._0_4_ * fVar103) |
                                 (uint)(1.0 - auVar285._0_4_ * fVar103) & uVar65);
              fStack_264 = (float)(~uVar66 & (uint)(auVar285._4_4_ * fVar127) |
                                  (uint)(1.0 - auVar285._4_4_ * fVar127) & uVar66);
              fStack_260 = (float)(~uVar67 & (uint)(auVar285._8_4_ * fVar134) |
                                  (uint)(1.0 - auVar285._8_4_ * fVar134) & uVar67);
              fStack_25c = (float)(~uVar68 & (uint)(auVar285._12_4_ * fVar148) |
                                  (uint)(1.0 - auVar285._12_4_ * fVar148) & uVar68);
              auVar93._8_4_ = auVar163._8_4_;
              auVar93._0_8_ = auVar163._0_8_;
              auVar93._12_4_ = auVar163._12_4_;
              local_408 = fVar151;
              fStack_404 = fVar126;
              fStack_400 = fVar128;
              fStack_3fc = fVar136;
            }
          }
        }
        iVar50 = movmskps(iVar50,auVar93);
        local_3a8 = fVar219;
        fStack_3a4 = fVar220;
        fStack_3a0 = fVar230;
        fStack_39c = fVar240;
        _local_388 = auVar289;
        if (iVar50 == 0) {
          bVar61 = false;
        }
        else {
          fVar101 = (auVar269._0_4_ - auVar191._0_4_) * local_3f8 + auVar191._0_4_;
          fVar103 = (auVar269._4_4_ - auVar191._4_4_) * fStack_3f4 + auVar191._4_4_;
          fVar126 = (auVar269._8_4_ - auVar191._8_4_) * fStack_3f0 + auVar191._8_4_;
          fVar127 = (auVar269._12_4_ - auVar191._12_4_) * fStack_3ec + auVar191._12_4_;
          fVar135 = *(float *)((long)local_300->ray_space + k * 4 + -0x10);
          auVar119._0_4_ = -(uint)(fVar135 * (fVar101 + fVar101) < local_408) & auVar93._0_4_;
          auVar119._4_4_ = -(uint)(fVar135 * (fVar103 + fVar103) < fStack_404) & auVar93._4_4_;
          auVar119._8_4_ = -(uint)(fVar135 * (fVar126 + fVar126) < fStack_400) & auVar93._8_4_;
          auVar119._12_4_ = -(uint)(fVar135 * (fVar127 + fVar127) < fStack_3fc) & auVar93._12_4_;
          uVar65 = movmskps((int)local_300,auVar119);
          if (uVar65 != 0) {
            local_268 = local_268 + local_268 + -1.0;
            fStack_264 = fStack_264 + fStack_264 + -1.0;
            fStack_260 = fStack_260 + fStack_260 + -1.0;
            fStack_25c = fStack_25c + fStack_25c + -1.0;
            local_198 = 0;
            local_188 = CONCAT44(fStack_364,local_368);
            uStack_180 = CONCAT44(fStack_35c,fStack_360);
            local_178 = CONCAT44(fStack_294,local_298);
            uStack_170 = CONCAT44(fStack_28c,fStack_290);
            local_168 = CONCAT44(fStack_2a4,local_2a8);
            uStack_160 = CONCAT44(fStack_29c,fStack_2a0);
            local_158 = CONCAT44(fStack_284,local_288);
            uStack_150 = CONCAT44(fStack_27c,fStack_280);
            pRVar56 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
            local_1c8 = local_3f8;
            fStack_1c4 = fStack_3f4;
            fStack_1c0 = fStack_3f0;
            fStack_1bc = fStack_3ec;
            local_1b8 = local_268;
            fStack_1b4 = fStack_264;
            fStack_1b0 = fStack_260;
            fStack_1ac = fStack_25c;
            local_1a8 = local_408;
            fStack_1a4 = fStack_404;
            fStack_1a0 = fStack_400;
            fStack_19c = fStack_3fc;
            local_194 = iVar18;
            local_148 = auVar119;
            if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              pRVar56 = context->args;
              if ((pRVar56->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar61 = true, pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar71 = 1.0 / fVar71;
                local_138[0] = fVar71 * (local_3f8 + 0.0);
                local_138[1] = fVar71 * (fStack_3f4 + 1.0);
                local_138[2] = fVar71 * (fStack_3f0 + 2.0);
                local_138[3] = fVar71 * (fStack_3ec + 3.0);
                local_128 = CONCAT44(fStack_264,local_268);
                uStack_120 = CONCAT44(fStack_25c,fStack_260);
                local_118[0] = local_408;
                local_118[1] = fStack_404;
                local_118[2] = fStack_400;
                local_118[3] = fStack_3fc;
                pGVar59 = (Geometry *)(ulong)(uVar65 & 0xff);
                uVar60 = 0;
                if (pGVar59 != (Geometry *)0x0) {
                  for (; ((uVar65 & 0xff) >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                  }
                }
                local_498 = CONCAT44((undefined4)local_3d0,(undefined4)local_3d0);
                uStack_490._0_4_ = (undefined4)local_3d0;
                uStack_490._4_4_ = (undefined4)local_3d0;
                local_438 = CONCAT44((undefined4)local_2b8,(undefined4)local_2b8);
                uStack_430._0_4_ = (undefined4)local_2b8;
                uStack_430._4_4_ = (undefined4)local_2b8;
                auVar25 = *(undefined1 (*) [12])*local_308;
                uStack_41c = (undefined4)((ulong)*(undefined8 *)(*local_308 + 8) >> 0x20);
                local_378 = *(float *)(ray + k * 4 + 0x80);
                do {
                  local_d8 = local_138[uVar60];
                  local_c8 = *(undefined4 *)((long)&local_128 + uVar60 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_118[uVar60];
                  fVar135 = 1.0 - local_d8;
                  fVar101 = local_d8 * fVar135 + local_d8 * fVar135;
                  fVar103 = (fVar101 - local_d8 * local_d8) * 3.0;
                  fVar71 = local_d8 * local_d8 * 3.0;
                  fVar101 = (fVar135 * fVar135 - fVar101) * 3.0;
                  local_2f8.context = context->user;
                  fVar135 = fVar135 * fVar135 * -3.0;
                  local_108 = fVar135 * local_368 +
                              fVar101 * local_298 + fVar103 * local_2a8 + fVar71 * local_288;
                  local_f8 = fVar135 * fStack_364 +
                             fVar101 * fStack_294 + fVar103 * fStack_2a4 + fVar71 * fStack_284;
                  local_e8 = fVar135 * fStack_360 +
                             fVar101 * fStack_290 + fVar103 * fStack_2a0 + fVar71 * fStack_280;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  uStack_c4 = local_c8;
                  uStack_c0 = local_c8;
                  uStack_bc = local_c8;
                  local_b8 = local_438;
                  uStack_b0 = uStack_430;
                  local_a8 = local_498;
                  uStack_a0 = uStack_490;
                  local_98 = (local_2f8.context)->instID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_88 = (local_2f8.context)->instPrimID[0];
                  uStack_84 = local_88;
                  uStack_80 = local_88;
                  uStack_7c = local_88;
                  local_3e8._12_4_ = uStack_41c;
                  local_3e8._0_12_ = auVar25;
                  local_2f8.valid = (int *)local_3e8;
                  pRVar56 = (RTCIntersectArguments *)pGVar19->userPtr;
                  local_2f8.hit = (RTCHitN *)&local_108;
                  local_2f8.N = 4;
                  p_Var53 = pGVar19->occlusionFilterN;
                  local_2f8.geometryUserPtr = pRVar56;
                  local_2f8.ray = (RTCRayN *)ray;
                  if (p_Var53 != (RTCFilterFunctionN)0x0) {
                    p_Var53 = (RTCFilterFunctionN)(*p_Var53)(&local_2f8);
                  }
                  auVar120._0_4_ = -(uint)(local_3e8._0_4_ == 0);
                  auVar120._4_4_ = -(uint)(local_3e8._4_4_ == 0);
                  auVar120._8_4_ = -(uint)(local_3e8._8_4_ == 0);
                  auVar120._12_4_ = -(uint)(local_3e8._12_4_ == 0);
                  uVar65 = movmskps((int)p_Var53,auVar120);
                  pRVar54 = (RTCRayN *)(ulong)(uVar65 ^ 0xf);
                  if ((uVar65 ^ 0xf) == 0) {
                    auVar120 = auVar120 ^ _DAT_01f7ae20;
                  }
                  else {
                    pRVar56 = context->args;
                    if ((pRVar56->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar56->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar56->filter)(&local_2f8);
                    }
                    auVar94._0_4_ = -(uint)(local_3e8._0_4_ == 0);
                    auVar94._4_4_ = -(uint)(local_3e8._4_4_ == 0);
                    auVar94._8_4_ = -(uint)(local_3e8._8_4_ == 0);
                    auVar94._12_4_ = -(uint)(local_3e8._12_4_ == 0);
                    auVar120 = auVar94 ^ _DAT_01f7ae20;
                    *(undefined1 (*) [16])(local_2f8.ray + 0x80) =
                         ~auVar94 & _DAT_01f7aa00 |
                         *(undefined1 (*) [16])(local_2f8.ray + 0x80) & auVar94;
                    pRVar54 = local_2f8.ray;
                  }
                  auVar121._0_4_ = auVar120._0_4_ << 0x1f;
                  auVar121._4_4_ = auVar120._4_4_ << 0x1f;
                  auVar121._8_4_ = auVar120._8_4_ << 0x1f;
                  auVar121._12_4_ = auVar120._12_4_ << 0x1f;
                  iVar50 = movmskps((int)pRVar54,auVar121);
                  if (iVar50 != 0) {
                    bVar61 = true;
                    break;
                  }
                  *(float *)(ray + k * 4 + 0x80) = local_378;
                  pGVar59 = (Geometry *)((ulong)pGVar59 ^ 1L << (uVar60 & 0x3f));
                  uVar60 = 0;
                  if (pGVar59 != (Geometry *)0x0) {
                    for (; ((ulong)pGVar59 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                    }
                  }
                  bVar61 = false;
                } while (pGVar59 != (Geometry *)0x0);
              }
              goto LAB_00b2c111;
            }
          }
          bVar61 = false;
        }
      }
LAB_00b2c111:
      uVar55 = SUB84(pRVar56,0);
      if (4 < iVar18) {
        local_58 = iVar18;
        iStack_54 = iVar18;
        iStack_50 = iVar18;
        iStack_4c = iVar18;
        local_3b8._4_4_ = local_3b8._0_4_;
        fStack_3b0 = (float)local_3b8._0_4_;
        fStack_3ac = (float)local_3b8._0_4_;
        local_78 = 1.0 / (float)local_2c8._0_4_;
        fStack_74 = local_78;
        fStack_70 = local_78;
        fStack_6c = local_78;
        local_2c8._4_4_ = (undefined4)local_3d0;
        local_2c8._0_4_ = (undefined4)local_3d0;
        local_2c8._8_4_ = (undefined4)local_3d0;
        local_2c8._12_4_ = (undefined4)local_3d0;
        local_68 = (undefined4)local_2b8;
        uStack_64 = (undefined4)local_2b8;
        uStack_60 = (undefined4)local_2b8;
        uStack_5c = (undefined4)local_2b8;
        lVar63 = 4;
        do {
          uVar66 = (uint)lVar63;
          puVar57 = bezier_basis0 + lVar23;
          pfVar1 = (float *)(puVar57 + lVar63 * 4);
          fVar135 = *pfVar1;
          fVar71 = pfVar1[1];
          fVar101 = pfVar1[2];
          fVar103 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21aa768 + lVar63 * 4);
          local_3a8 = *pfVar1;
          fStack_3a4 = pfVar1[1];
          fStack_3a0 = pfVar1[2];
          fStack_39c = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21aabec + lVar63 * 4);
          local_248 = *pfVar1;
          fStack_244 = pfVar1[1];
          fStack_240 = pfVar1[2];
          fStack_23c = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21ab070 + lVar63 * 4);
          local_398 = *pfVar1;
          fStack_394 = pfVar1[1];
          fStack_390 = pfVar1[2];
          fStack_38c = pfVar1[3];
          local_378 = local_1d8 * fVar135 +
                      fVar173 * local_3a8 + fVar198 * local_248 + fVar100 * local_398;
          fStack_374 = fStack_1d4 * fVar71 +
                       fVar173 * fStack_3a4 + fVar198 * fStack_244 + fVar100 * fStack_394;
          fStack_370 = fStack_1d0 * fVar101 +
                       fVar173 * fStack_3a0 + fVar198 * fStack_240 + fVar100 * fStack_390;
          fStack_36c = fStack_1cc * fVar103 +
                       fVar173 * fStack_39c + fVar198 * fStack_23c + fVar100 * fStack_38c;
          local_388._0_4_ =
               local_238 * fVar135 +
               fVar196 * local_3a8 + local_318 * local_248 + local_328 * local_398;
          local_388._4_4_ =
               fStack_234 * fVar71 +
               fVar196 * fStack_3a4 + fStack_314 * fStack_244 + fStack_324 * fStack_394;
          fStack_380 = fStack_230 * fVar101 +
                       fVar196 * fStack_3a0 + fStack_310 * fStack_240 + fStack_320 * fStack_390;
          fStack_37c = fStack_22c * fVar103 +
                       fVar196 * fStack_39c + fStack_30c * fStack_23c + fStack_31c * fStack_38c;
          auVar123._0_4_ =
               local_218 * fVar135 +
               local_208 * local_3a8 + local_1e8 * local_248 + local_1f8 * local_398;
          auVar123._4_4_ =
               fStack_214 * fVar71 +
               fStack_204 * fStack_3a4 + fStack_1e4 * fStack_244 + fStack_1f4 * fStack_394;
          auVar123._8_4_ =
               fStack_210 * fVar101 +
               fStack_200 * fStack_3a0 + fStack_1e0 * fStack_240 + fStack_1f0 * fStack_390;
          auVar123._12_4_ =
               fStack_20c * fVar103 +
               fStack_1fc * fStack_39c + fStack_1dc * fStack_23c + fStack_1ec * fStack_38c;
          pfVar1 = (float *)(bezier_basis1 + lVar23 + lVar63 * 4);
          fVar126 = *pfVar1;
          fVar127 = pfVar1[1];
          fVar128 = pfVar1[2];
          fVar134 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21acb88 + lVar63 * 4);
          fVar136 = *pfVar1;
          fVar148 = pfVar1[1];
          fVar151 = pfVar1[2];
          fVar156 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21ad00c + lVar63 * 4);
          fVar168 = *pfVar1;
          fVar170 = pfVar1[1];
          fVar202 = pfVar1[2];
          fVar203 = pfVar1[3];
          pfVar1 = (float *)(lVar23 + 0x21ad490 + lVar63 * 4);
          fVar204 = *pfVar1;
          fVar212 = pfVar1[1];
          fVar214 = pfVar1[2];
          fVar221 = pfVar1[3];
          fVar219 = local_1d8 * fVar126 + fVar173 * fVar136 + fVar198 * fVar168 + fVar100 * fVar204;
          fVar230 = fStack_1d4 * fVar127 + fVar173 * fVar148 + fVar198 * fVar170 + fVar100 * fVar212
          ;
          fVar243 = fStack_1d0 * fVar128 + fVar173 * fVar151 + fVar198 * fVar202 + fVar100 * fVar214
          ;
          fVar256 = fStack_1cc * fVar134 + fVar173 * fVar156 + fVar198 * fVar203 + fVar100 * fVar221
          ;
          fVar260 = local_238 * fVar126 +
                    fVar196 * fVar136 + local_318 * fVar168 + local_328 * fVar204;
          fVar262 = fStack_234 * fVar127 +
                    fVar196 * fVar148 + fStack_314 * fVar170 + fStack_324 * fVar212;
          fVar272 = fStack_230 * fVar128 +
                    fVar196 * fVar151 + fStack_310 * fVar202 + fStack_320 * fVar214;
          fVar273 = fStack_22c * fVar134 +
                    fVar196 * fVar156 + fStack_30c * fVar203 + fStack_31c * fVar221;
          auVar286._0_4_ =
               local_218 * fVar126 + local_208 * fVar136 + local_1e8 * fVar168 + local_1f8 * fVar204
          ;
          auVar286._4_4_ =
               fStack_214 * fVar127 +
               fStack_204 * fVar148 + fStack_1e4 * fVar170 + fStack_1f4 * fVar212;
          auVar286._8_4_ =
               fStack_210 * fVar128 +
               fStack_200 * fVar151 + fStack_1e0 * fVar202 + fStack_1f0 * fVar214;
          auVar286._12_4_ =
               fStack_20c * fVar134 +
               fStack_1fc * fVar156 + fStack_1dc * fVar203 + fStack_1ec * fVar221;
          fVar220 = fVar219 - local_378;
          fVar240 = fVar230 - fStack_374;
          fVar248 = fVar243 - fStack_370;
          fVar258 = fVar256 - fStack_36c;
          fVar228 = fVar260 - (float)local_388._0_4_;
          fVar229 = fVar262 - (float)local_388._4_4_;
          fVar275 = fVar272 - fStack_380;
          fVar217 = fVar273 - fStack_37c;
          fVar274 = (float)local_388._0_4_ * fVar220 - local_378 * fVar228;
          fVar276 = (float)local_388._4_4_ * fVar240 - fStack_374 * fVar229;
          fVar282 = fStack_380 * fVar248 - fStack_370 * fVar275;
          fVar283 = fStack_37c * fVar258 - fStack_36c * fVar217;
          auVar72 = maxps(auVar123,auVar286);
          bVar46 = fVar274 * fVar274 <=
                   auVar72._0_4_ * auVar72._0_4_ * (fVar220 * fVar220 + fVar228 * fVar228) &&
                   (int)uVar66 < local_58;
          auVar211._0_4_ = -(uint)bVar46;
          bVar47 = fVar276 * fVar276 <=
                   auVar72._4_4_ * auVar72._4_4_ * (fVar240 * fVar240 + fVar229 * fVar229) &&
                   (int)(uVar66 | 1) < iStack_54;
          auVar211._4_4_ = -(uint)bVar47;
          bVar48 = fVar282 * fVar282 <=
                   auVar72._8_4_ * auVar72._8_4_ * (fVar248 * fVar248 + fVar275 * fVar275) &&
                   (int)(uVar66 | 2) < iStack_50;
          auVar211._8_4_ = -(uint)bVar48;
          bVar49 = fVar283 * fVar283 <=
                   auVar72._12_4_ * auVar72._12_4_ * (fVar258 * fVar258 + fVar217 * fVar217) &&
                   (int)(uVar66 | 3) < iStack_4c;
          auVar211._12_4_ = -(uint)bVar49;
          uVar65 = movmskps((int)pGVar59,auVar211);
          pGVar59 = (Geometry *)(ulong)uVar65;
          if (uVar65 != 0) {
            local_2b8 = CONCAT44(fVar240,fVar220);
            fVar259 = fVar204 * local_358 + fVar168 * local_348 + fVar136 * local_338 +
                      fVar126 * fVar197;
            fVar261 = fVar212 * fStack_354 + fVar170 * fStack_344 + fVar148 * fStack_334 +
                      fVar127 * fVar197;
            fVar137 = fVar214 * fStack_350 + fVar202 * fStack_340 + fVar151 * fStack_330 +
                      fVar128 * fVar197;
            fVar138 = fVar221 * fStack_34c + fVar203 * fStack_33c + fVar156 * fStack_32c +
                      fVar134 * fVar197;
            fVar154 = local_398 * local_358 + local_248 * local_348 + local_3a8 * local_338 +
                      fVar135 * fVar197;
            fVar155 = fStack_394 * fStack_354 + fStack_244 * fStack_344 + fStack_3a4 * fStack_334 +
                      fVar71 * fVar197;
            fVar157 = fStack_390 * fStack_350 + fStack_240 * fStack_340 + fStack_3a0 * fStack_330 +
                      fVar101 * fVar197;
            fVar169 = fStack_38c * fStack_34c + fStack_23c * fStack_33c + fStack_39c * fStack_32c +
                      fVar103 * fVar197;
            pfVar1 = (float *)(lVar23 + 0x21ab4f4 + lVar63 * 4);
            fVar135 = *pfVar1;
            fVar71 = pfVar1[1];
            fVar101 = pfVar1[2];
            fVar103 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21ab978 + lVar63 * 4);
            fVar126 = *pfVar1;
            fVar127 = pfVar1[1];
            fVar128 = pfVar1[2];
            fVar134 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21abdfc + lVar63 * 4);
            fVar136 = *pfVar1;
            fVar148 = pfVar1[1];
            fVar151 = pfVar1[2];
            fVar156 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21ac280 + lVar63 * 4);
            fVar168 = *pfVar1;
            fVar170 = pfVar1[1];
            fVar202 = pfVar1[2];
            fVar203 = pfVar1[3];
            fVar171 = local_1d8 * fVar135 +
                      fVar173 * fVar126 + fVar198 * fVar136 + fVar100 * fVar168;
            fVar172 = fStack_1d4 * fVar71 +
                      fVar173 * fVar127 + fVar198 * fVar148 + fVar100 * fVar170;
            fVar205 = fStack_1d0 * fVar101 +
                      fVar173 * fVar128 + fVar198 * fVar151 + fVar100 * fVar202;
            fVar213 = fStack_1cc * fVar103 +
                      fVar173 * fVar134 + fVar198 * fVar156 + fVar100 * fVar203;
            fVar149 = local_238 * fVar135 +
                      fVar196 * fVar126 + local_318 * fVar136 + local_328 * fVar168;
            fVar150 = fStack_234 * fVar71 +
                      fVar196 * fVar127 + fStack_314 * fVar148 + fStack_324 * fVar170;
            fVar152 = fStack_230 * fVar101 +
                      fVar196 * fVar128 + fStack_310 * fVar151 + fStack_320 * fVar202;
            fVar153 = fStack_22c * fVar103 +
                      fVar196 * fVar134 + fStack_30c * fVar156 + fStack_31c * fVar203;
            pfVar1 = (float *)(lVar23 + 0x21ad914 + lVar63 * 4);
            fVar204 = *pfVar1;
            fVar212 = pfVar1[1];
            fVar214 = pfVar1[2];
            fVar221 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21ae21c + lVar63 * 4);
            fVar274 = *pfVar1;
            fVar276 = pfVar1[1];
            fVar282 = pfVar1[2];
            fVar283 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21ae6a0 + lVar63 * 4);
            fVar284 = *pfVar1;
            fVar263 = pfVar1[1];
            fVar232 = pfVar1[2];
            fVar242 = pfVar1[3];
            pfVar1 = (float *)(lVar23 + 0x21add98 + lVar63 * 4);
            fVar245 = *pfVar1;
            fVar247 = pfVar1[1];
            fVar249 = pfVar1[2];
            fVar257 = pfVar1[3];
            fVar215 = local_1d8 * fVar204 +
                      fVar173 * fVar245 + fVar198 * fVar274 + fVar100 * fVar284;
            fVar216 = fStack_1d4 * fVar212 +
                      fVar173 * fVar247 + fVar198 * fVar276 + fVar100 * fVar263;
            fVar231 = fStack_1d0 * fVar214 +
                      fVar173 * fVar249 + fVar198 * fVar282 + fVar100 * fVar232;
            fVar241 = fStack_1cc * fVar221 +
                      fVar173 * fVar257 + fVar198 * fVar283 + fVar100 * fVar242;
            fVar244 = local_238 * fVar204 +
                      fVar196 * fVar245 + local_318 * fVar274 + local_328 * fVar284;
            fVar246 = fStack_234 * fVar212 +
                      fVar196 * fVar247 + fStack_314 * fVar276 + fStack_324 * fVar263;
            fVar288 = fStack_230 * fVar214 +
                      fVar196 * fVar249 + fStack_310 * fVar282 + fStack_320 * fVar232;
            fVar290 = fStack_22c * fVar221 +
                      fVar196 * fVar257 + fStack_30c * fVar283 + fStack_31c * fVar242;
            auVar271._0_8_ = CONCAT44(fVar172,fVar171) & 0x7fffffff7fffffff;
            auVar271._8_4_ = ABS(fVar205);
            auVar271._12_4_ = ABS(fVar213);
            auVar193._0_8_ = CONCAT44(fVar150,fVar149) & 0x7fffffff7fffffff;
            auVar193._8_4_ = ABS(fVar152);
            auVar193._12_4_ = ABS(fVar153);
            auVar72 = maxps(auVar271,auVar193);
            auVar280._0_8_ =
                 CONCAT44(fVar71 * fVar197 +
                          fVar127 * fStack_334 + fVar148 * fStack_344 + fVar170 * fStack_354,
                          fVar135 * fVar197 +
                          fVar126 * local_338 + fVar136 * local_348 + fVar168 * local_358) &
                 0x7fffffff7fffffff;
            auVar280._8_4_ =
                 ABS(fVar101 * fVar197 +
                     fVar128 * fStack_330 + fVar151 * fStack_340 + fVar202 * fStack_350);
            auVar280._12_4_ =
                 ABS(fVar103 * fVar197 +
                     fVar134 * fStack_32c + fVar156 * fStack_33c + fVar203 * fStack_34c);
            auVar72 = maxps(auVar72,auVar280);
            uVar65 = -(uint)(local_418 <= auVar72._0_4_);
            uVar67 = -(uint)(local_418 <= auVar72._4_4_);
            uVar68 = -(uint)(local_418 <= auVar72._8_4_);
            uVar69 = -(uint)(local_418 <= auVar72._12_4_);
            auVar194._0_4_ = ~uVar65 & (uint)fVar220;
            auVar194._4_4_ = ~uVar67 & (uint)fVar240;
            auVar194._8_4_ = ~uVar68 & (uint)fVar248;
            auVar194._12_4_ = ~uVar69 & (uint)fVar258;
            auVar255._0_4_ = (uint)fVar171 & uVar65;
            auVar255._4_4_ = (uint)fVar172 & uVar67;
            auVar255._8_4_ = (uint)fVar205 & uVar68;
            auVar255._12_4_ = (uint)fVar213 & uVar69;
            auVar255 = auVar255 | auVar194;
            fVar149 = (float)(~uVar65 & (uint)fVar228 | (uint)fVar149 & uVar65);
            fVar150 = (float)(~uVar67 & (uint)fVar229 | (uint)fVar150 & uVar67);
            fVar152 = (float)(~uVar68 & (uint)fVar275 | (uint)fVar152 & uVar68);
            fVar153 = (float)(~uVar69 & (uint)fVar217 | (uint)fVar153 & uVar69);
            auVar281._0_8_ = CONCAT44(fVar216,fVar215) & 0x7fffffff7fffffff;
            auVar281._8_4_ = ABS(fVar231);
            auVar281._12_4_ = ABS(fVar241);
            auVar131._0_8_ = CONCAT44(fVar246,fVar244) & 0x7fffffff7fffffff;
            auVar131._8_4_ = ABS(fVar288);
            auVar131._12_4_ = ABS(fVar290);
            auVar72 = maxps(auVar281,auVar131);
            auVar95._0_8_ =
                 CONCAT44(fVar212 * fVar197 +
                          fVar247 * fStack_334 + fVar276 * fStack_344 + fVar263 * fStack_354,
                          fVar204 * fVar197 +
                          fVar245 * local_338 + fVar274 * local_348 + fVar284 * local_358) &
                 0x7fffffff7fffffff;
            auVar95._8_4_ =
                 ABS(fVar214 * fVar197 +
                     fVar249 * fStack_330 + fVar282 * fStack_340 + fVar232 * fStack_350);
            auVar95._12_4_ =
                 ABS(fVar221 * fVar197 +
                     fVar257 * fStack_32c + fVar283 * fStack_33c + fVar242 * fStack_34c);
            auVar72 = maxps(auVar72,auVar95);
            uVar65 = -(uint)(local_418 <= auVar72._0_4_);
            uVar67 = -(uint)(local_418 <= auVar72._4_4_);
            uVar68 = -(uint)(local_418 <= auVar72._8_4_);
            uVar69 = -(uint)(local_418 <= auVar72._12_4_);
            fVar232 = (float)((uint)fVar215 & uVar65 | ~uVar65 & (uint)fVar220);
            fVar242 = (float)((uint)fVar216 & uVar67 | ~uVar67 & (uint)fVar240);
            fVar245 = (float)((uint)fVar231 & uVar68 | ~uVar68 & (uint)fVar248);
            fVar247 = (float)((uint)fVar241 & uVar69 | ~uVar69 & (uint)fVar258);
            fVar228 = (float)(~uVar65 & (uint)fVar228 | (uint)fVar244 & uVar65);
            fVar220 = (float)(~uVar67 & (uint)fVar229 | (uint)fVar246 & uVar67);
            fVar275 = (float)(~uVar68 & (uint)fVar275 | (uint)fVar288 & uVar68);
            fVar240 = (float)(~uVar69 & (uint)fVar217 | (uint)fVar290 & uVar69);
            fVar134 = auVar255._0_4_;
            fVar135 = auVar255._4_4_;
            fVar71 = auVar255._8_4_;
            fVar101 = auVar255._12_4_;
            auVar164._0_4_ = fVar149 * fVar149 + fVar134 * fVar134;
            auVar164._4_4_ = fVar150 * fVar150 + fVar135 * fVar135;
            auVar164._8_4_ = fVar152 * fVar152 + fVar71 * fVar71;
            auVar164._12_4_ = fVar153 * fVar153 + fVar101 * fVar101;
            auVar72 = rsqrtps(auVar194,auVar164);
            fVar103 = auVar72._0_4_;
            fVar126 = auVar72._4_4_;
            fVar127 = auVar72._8_4_;
            fVar128 = auVar72._12_4_;
            auVar195._0_4_ = fVar103 * fVar103 * auVar164._0_4_ * 0.5 * fVar103;
            auVar195._4_4_ = fVar126 * fVar126 * auVar164._4_4_ * 0.5 * fVar126;
            auVar195._8_4_ = fVar127 * fVar127 * auVar164._8_4_ * 0.5 * fVar127;
            auVar195._12_4_ = fVar128 * fVar128 * auVar164._12_4_ * 0.5 * fVar128;
            fVar168 = fVar103 * 1.5 - auVar195._0_4_;
            fVar170 = fVar126 * 1.5 - auVar195._4_4_;
            fVar202 = fVar127 * 1.5 - auVar195._8_4_;
            fVar203 = fVar128 * 1.5 - auVar195._12_4_;
            auVar165._0_4_ = fVar228 * fVar228 + fVar232 * fVar232;
            auVar165._4_4_ = fVar220 * fVar220 + fVar242 * fVar242;
            auVar165._8_4_ = fVar275 * fVar275 + fVar245 * fVar245;
            auVar165._12_4_ = fVar240 * fVar240 + fVar247 * fVar247;
            auVar72 = rsqrtps(auVar195,auVar165);
            fVar103 = auVar72._0_4_;
            fVar126 = auVar72._4_4_;
            fVar127 = auVar72._8_4_;
            fVar128 = auVar72._12_4_;
            fVar136 = fVar103 * 1.5 - fVar103 * fVar103 * auVar165._0_4_ * 0.5 * fVar103;
            fVar148 = fVar126 * 1.5 - fVar126 * fVar126 * auVar165._4_4_ * 0.5 * fVar126;
            fVar151 = fVar127 * 1.5 - fVar127 * fVar127 * auVar165._8_4_ * 0.5 * fVar127;
            fVar156 = fVar128 * 1.5 - fVar128 * fVar128 * auVar165._12_4_ * 0.5 * fVar128;
            fVar229 = fVar149 * fVar168 * auVar123._0_4_;
            fVar217 = fVar150 * fVar170 * auVar123._4_4_;
            fVar149 = fVar152 * fVar202 * auVar123._8_4_;
            fVar152 = fVar153 * fVar203 * auVar123._12_4_;
            fVar126 = -fVar134 * fVar168 * auVar123._0_4_;
            fVar127 = -fVar135 * fVar170 * auVar123._4_4_;
            fVar128 = -fVar71 * fVar202 * auVar123._8_4_;
            fVar134 = -fVar101 * fVar203 * auVar123._12_4_;
            fVar204 = fVar168 * 0.0 * auVar123._0_4_;
            fVar212 = fVar170 * 0.0 * auVar123._4_4_;
            fVar214 = fVar202 * 0.0 * auVar123._8_4_;
            fVar221 = fVar203 * 0.0 * auVar123._12_4_;
            local_398 = fVar154 + fVar204;
            fStack_394 = fVar155 + fVar212;
            fStack_390 = fVar157 + fVar214;
            fStack_38c = fVar169 + fVar221;
            fVar274 = fVar228 * fVar136 * auVar286._0_4_;
            fVar276 = fVar220 * fVar148 * auVar286._4_4_;
            fVar171 = fVar275 * fVar151 * auVar286._8_4_;
            fVar172 = fVar240 * fVar156 * auVar286._12_4_;
            fVar282 = fVar219 + fVar274;
            fVar283 = fVar230 + fVar276;
            fVar284 = fVar243 + fVar171;
            fVar263 = fVar256 + fVar172;
            fVar135 = -fVar232 * fVar136 * auVar286._0_4_;
            fVar71 = -fVar242 * fVar148 * auVar286._4_4_;
            fVar101 = -fVar245 * fVar151 * auVar286._8_4_;
            fVar103 = -fVar247 * fVar156 * auVar286._12_4_;
            fVar232 = fVar260 + fVar135;
            fVar242 = fVar262 + fVar71;
            fVar245 = fVar272 + fVar101;
            fVar247 = fVar273 + fVar103;
            fVar168 = fVar136 * 0.0 * auVar286._0_4_;
            fVar170 = fVar148 * 0.0 * auVar286._4_4_;
            fVar202 = fVar151 * 0.0 * auVar286._8_4_;
            fVar203 = fVar156 * 0.0 * auVar286._12_4_;
            fVar136 = local_378 - fVar229;
            fVar148 = fStack_374 - fVar217;
            fVar151 = fStack_370 - fVar149;
            fVar156 = fStack_36c - fVar152;
            fVar249 = fVar259 + fVar168;
            fVar257 = fVar261 + fVar170;
            fVar150 = fVar137 + fVar202;
            fVar153 = fVar138 + fVar203;
            fVar228 = (float)local_388._0_4_ - fVar126;
            fVar275 = (float)local_388._4_4_ - fVar127;
            fVar220 = fStack_380 - fVar128;
            fVar240 = fStack_37c - fVar134;
            fVar154 = fVar154 - fVar204;
            fVar155 = fVar155 - fVar212;
            fVar157 = fVar157 - fVar214;
            fVar169 = fVar169 - fVar221;
            uVar65 = -(uint)(0.0 < (fVar228 * (fVar249 - fVar154) - fVar154 * (fVar232 - fVar228)) *
                                   0.0 + (fVar154 * (fVar282 - fVar136) -
                                         (fVar249 - fVar154) * fVar136) * 0.0 +
                                         ((fVar232 - fVar228) * fVar136 -
                                         (fVar282 - fVar136) * fVar228));
            uVar67 = -(uint)(0.0 < (fVar275 * (fVar257 - fVar155) - fVar155 * (fVar242 - fVar275)) *
                                   0.0 + (fVar155 * (fVar283 - fVar148) -
                                         (fVar257 - fVar155) * fVar148) * 0.0 +
                                         ((fVar242 - fVar275) * fVar148 -
                                         (fVar283 - fVar148) * fVar275));
            uVar68 = -(uint)(0.0 < (fVar220 * (fVar150 - fVar157) - fVar157 * (fVar245 - fVar220)) *
                                   0.0 + (fVar157 * (fVar284 - fVar151) -
                                         (fVar150 - fVar157) * fVar151) * 0.0 +
                                         ((fVar245 - fVar220) * fVar151 -
                                         (fVar284 - fVar151) * fVar220));
            uVar69 = -(uint)(0.0 < (fVar240 * (fVar153 - fVar169) - fVar169 * (fVar247 - fVar240)) *
                                   0.0 + (fVar169 * (fVar263 - fVar156) -
                                         (fVar153 - fVar169) * fVar156) * 0.0 +
                                         ((fVar247 - fVar240) * fVar156 -
                                         (fVar263 - fVar156) * fVar240));
            fVar274 = (float)((uint)(fVar219 - fVar274) & uVar65 |
                             ~uVar65 & (uint)(local_378 + fVar229));
            fVar276 = (float)((uint)(fVar230 - fVar276) & uVar67 |
                             ~uVar67 & (uint)(fStack_374 + fVar217));
            fVar243 = (float)((uint)(fVar243 - fVar171) & uVar68 |
                             ~uVar68 & (uint)(fStack_370 + fVar149));
            fVar256 = (float)((uint)(fVar256 - fVar172) & uVar69 |
                             ~uVar69 & (uint)(fStack_36c + fVar152));
            fVar149 = (float)((uint)(fVar260 - fVar135) & uVar65 |
                             ~uVar65 & (uint)((float)local_388._0_4_ + fVar126));
            fVar152 = (float)((uint)(fVar262 - fVar71) & uVar67 |
                             ~uVar67 & (uint)((float)local_388._4_4_ + fVar127));
            fVar171 = (float)((uint)(fVar272 - fVar101) & uVar68 |
                             ~uVar68 & (uint)(fStack_380 + fVar128));
            fVar172 = (float)((uint)(fVar273 - fVar103) & uVar69 |
                             ~uVar69 & (uint)(fStack_37c + fVar134));
            fVar126 = (float)((uint)(fVar259 - fVar168) & uVar65 | ~uVar65 & (uint)local_398);
            fVar127 = (float)((uint)(fVar261 - fVar170) & uVar67 | ~uVar67 & (uint)fStack_394);
            fVar128 = (float)((uint)(fVar137 - fVar202) & uVar68 | ~uVar68 & (uint)fStack_390);
            fVar134 = (float)((uint)(fVar138 - fVar203) & uVar69 | ~uVar69 & (uint)fStack_38c);
            fVar204 = (float)((uint)fVar136 & uVar65 | ~uVar65 & (uint)fVar282);
            fVar212 = (float)((uint)fVar148 & uVar67 | ~uVar67 & (uint)fVar283);
            fVar214 = (float)((uint)fVar151 & uVar68 | ~uVar68 & (uint)fVar284);
            fVar221 = (float)((uint)fVar156 & uVar69 | ~uVar69 & (uint)fVar263);
            fVar229 = (float)((uint)fVar228 & uVar65 | ~uVar65 & (uint)fVar232);
            fVar217 = (float)((uint)fVar275 & uVar67 | ~uVar67 & (uint)fVar242);
            fVar219 = (float)((uint)fVar220 & uVar68 | ~uVar68 & (uint)fVar245);
            fVar230 = (float)((uint)fVar240 & uVar69 | ~uVar69 & (uint)fVar247);
            fVar168 = (float)((uint)fVar154 & uVar65 | ~uVar65 & (uint)fVar249);
            fVar170 = (float)((uint)fVar155 & uVar67 | ~uVar67 & (uint)fVar257);
            fVar202 = (float)((uint)fVar157 & uVar68 | ~uVar68 & (uint)fVar150);
            fVar203 = (float)((uint)fVar169 & uVar69 | ~uVar69 & (uint)fVar153);
            fVar260 = (float)((uint)fVar282 & uVar65 | ~uVar65 & (uint)fVar136) - fVar274;
            fVar262 = (float)((uint)fVar283 & uVar67 | ~uVar67 & (uint)fVar148) - fVar276;
            fVar272 = (float)((uint)fVar284 & uVar68 | ~uVar68 & (uint)fVar151) - fVar243;
            fVar273 = (float)((uint)fVar263 & uVar69 | ~uVar69 & (uint)fVar156) - fVar256;
            fVar228 = (float)((uint)fVar232 & uVar65 | ~uVar65 & (uint)fVar228) - fVar149;
            fVar275 = (float)((uint)fVar242 & uVar67 | ~uVar67 & (uint)fVar275) - fVar152;
            fVar220 = (float)((uint)fVar245 & uVar68 | ~uVar68 & (uint)fVar220) - fVar171;
            fVar240 = (float)((uint)fVar247 & uVar69 | ~uVar69 & (uint)fVar240) - fVar172;
            fVar282 = (float)((uint)fVar249 & uVar65 | ~uVar65 & (uint)fVar154) - fVar126;
            fVar283 = (float)((uint)fVar257 & uVar67 | ~uVar67 & (uint)fVar155) - fVar127;
            fVar284 = (float)((uint)fVar150 & uVar68 | ~uVar68 & (uint)fVar157) - fVar128;
            fVar263 = (float)((uint)fVar153 & uVar69 | ~uVar69 & (uint)fVar169) - fVar134;
            fVar249 = fVar274 - fVar204;
            fVar257 = fVar276 - fVar212;
            fVar259 = fVar243 - fVar214;
            fVar261 = fVar256 - fVar221;
            fVar135 = fVar149 - fVar229;
            fVar71 = fVar152 - fVar217;
            fVar101 = fVar171 - fVar219;
            fVar103 = fVar172 - fVar230;
            fVar136 = fVar126 - fVar168;
            fVar148 = fVar127 - fVar170;
            fVar151 = fVar128 - fVar202;
            fVar156 = fVar134 - fVar203;
            fVar232 = (fVar149 * fVar282 - fVar126 * fVar228) * 0.0 +
                      (fVar126 * fVar260 - fVar274 * fVar282) * 0.0 +
                      (fVar274 * fVar228 - fVar149 * fVar260);
            fVar242 = (fVar152 * fVar283 - fVar127 * fVar275) * 0.0 +
                      (fVar127 * fVar262 - fVar276 * fVar283) * 0.0 +
                      (fVar276 * fVar275 - fVar152 * fVar262);
            auVar146._4_4_ = fVar242;
            auVar146._0_4_ = fVar232;
            fVar245 = (fVar171 * fVar284 - fVar128 * fVar220) * 0.0 +
                      (fVar128 * fVar272 - fVar243 * fVar284) * 0.0 +
                      (fVar243 * fVar220 - fVar171 * fVar272);
            fVar247 = (fVar172 * fVar263 - fVar134 * fVar240) * 0.0 +
                      (fVar134 * fVar273 - fVar256 * fVar263) * 0.0 +
                      (fVar256 * fVar240 - fVar172 * fVar273);
            auVar287._0_4_ =
                 (fVar229 * fVar136 - fVar168 * fVar135) * 0.0 +
                 (fVar168 * fVar249 - fVar204 * fVar136) * 0.0 +
                 (fVar204 * fVar135 - fVar229 * fVar249);
            auVar287._4_4_ =
                 (fVar217 * fVar148 - fVar170 * fVar71) * 0.0 +
                 (fVar170 * fVar257 - fVar212 * fVar148) * 0.0 +
                 (fVar212 * fVar71 - fVar217 * fVar257);
            auVar287._8_4_ =
                 (fVar219 * fVar151 - fVar202 * fVar101) * 0.0 +
                 (fVar202 * fVar259 - fVar214 * fVar151) * 0.0 +
                 (fVar214 * fVar101 - fVar219 * fVar259);
            auVar287._12_4_ =
                 (fVar230 * fVar156 - fVar203 * fVar103) * 0.0 +
                 (fVar203 * fVar261 - fVar221 * fVar156) * 0.0 +
                 (fVar221 * fVar103 - fVar230 * fVar261);
            auVar146._8_4_ = fVar245;
            auVar146._12_4_ = fVar247;
            auVar72 = maxps(auVar146,auVar287);
            bVar46 = auVar72._0_4_ <= 0.0 && bVar46;
            auVar147._0_4_ = -(uint)bVar46;
            bVar47 = auVar72._4_4_ <= 0.0 && bVar47;
            auVar147._4_4_ = -(uint)bVar47;
            bVar48 = auVar72._8_4_ <= 0.0 && bVar48;
            auVar147._8_4_ = -(uint)bVar48;
            bVar49 = auVar72._12_4_ <= 0.0 && bVar49;
            auVar147._12_4_ = -(uint)bVar49;
            iVar50 = movmskps((int)(bezier_basis1 + lVar23),auVar147);
            if (iVar50 == 0) {
LAB_00b2d041:
              auVar133._8_8_ = uStack_3c0;
              auVar133._0_8_ = local_3c8;
            }
            else {
              fVar170 = fVar135 * fVar282 - fVar136 * fVar228;
              fVar202 = fVar71 * fVar283 - fVar148 * fVar275;
              fVar203 = fVar101 * fVar284 - fVar151 * fVar220;
              fVar204 = fVar103 * fVar263 - fVar156 * fVar240;
              fVar168 = fVar136 * fVar260 - fVar282 * fVar249;
              fVar148 = fVar148 * fVar262 - fVar283 * fVar257;
              fVar151 = fVar151 * fVar272 - fVar284 * fVar259;
              fVar156 = fVar156 * fVar273 - fVar263 * fVar261;
              fVar135 = fVar249 * fVar228 - fVar135 * fVar260;
              fVar212 = fVar257 * fVar275 - fVar71 * fVar262;
              fVar214 = fVar259 * fVar220 - fVar101 * fVar272;
              fVar221 = fVar261 * fVar240 - fVar103 * fVar273;
              auVar132._0_4_ = fVar168 * 0.0 + fVar135;
              auVar132._4_4_ = fVar148 * 0.0 + fVar212;
              auVar132._8_4_ = fVar151 * 0.0 + fVar214;
              auVar132._12_4_ = fVar156 * 0.0 + fVar221;
              auVar201._0_4_ = fVar170 * 0.0 + auVar132._0_4_;
              auVar201._4_4_ = fVar202 * 0.0 + auVar132._4_4_;
              auVar201._8_4_ = fVar203 * 0.0 + auVar132._8_4_;
              auVar201._12_4_ = fVar204 * 0.0 + auVar132._12_4_;
              auVar72 = rcpps(auVar132,auVar201);
              fVar71 = auVar72._0_4_;
              fVar101 = auVar72._4_4_;
              fVar103 = auVar72._8_4_;
              fVar136 = auVar72._12_4_;
              fVar71 = (1.0 - auVar201._0_4_ * fVar71) * fVar71 + fVar71;
              fVar101 = (1.0 - auVar201._4_4_ * fVar101) * fVar101 + fVar101;
              fVar103 = (1.0 - auVar201._8_4_ * fVar103) * fVar103 + fVar103;
              fVar136 = (1.0 - auVar201._12_4_ * fVar136) * fVar136 + fVar136;
              fVar126 = (fVar126 * fVar135 + fVar149 * fVar168 + fVar274 * fVar170) * fVar71;
              fVar127 = (fVar127 * fVar212 + fVar152 * fVar148 + fVar276 * fVar202) * fVar101;
              fVar128 = (fVar128 * fVar214 + fVar171 * fVar151 + fVar243 * fVar203) * fVar103;
              fVar134 = (fVar134 * fVar221 + fVar172 * fVar156 + fVar256 * fVar204) * fVar136;
              fVar135 = *(float *)(ray + k * 4 + 0x80);
              bVar46 = ((float)local_3b8._0_4_ <= fVar126 && fVar126 <= fVar135) && bVar46;
              auVar166._0_4_ = -(uint)bVar46;
              bVar47 = ((float)local_3b8._4_4_ <= fVar127 && fVar127 <= fVar135) && bVar47;
              auVar166._4_4_ = -(uint)bVar47;
              bVar48 = (fStack_3b0 <= fVar128 && fVar128 <= fVar135) && bVar48;
              auVar166._8_4_ = -(uint)bVar48;
              bVar49 = (fStack_3ac <= fVar134 && fVar134 <= fVar135) && bVar49;
              auVar166._12_4_ = -(uint)bVar49;
              iVar50 = movmskps(iVar50,auVar166);
              if (iVar50 == 0) goto LAB_00b2d041;
              auVar167._0_8_ =
                   CONCAT44(-(uint)(auVar201._4_4_ != 0.0 && bVar47),
                            -(uint)(auVar201._0_4_ != 0.0 && bVar46));
              auVar167._8_4_ = -(uint)(auVar201._8_4_ != 0.0 && bVar48);
              auVar167._12_4_ = -(uint)(auVar201._12_4_ != 0.0 && bVar49);
              iVar50 = movmskps(iVar50,auVar167);
              auVar133._8_8_ = uStack_3c0;
              auVar133._0_8_ = local_3c8;
              if (iVar50 != 0) {
                fVar232 = fVar232 * fVar71;
                fVar242 = fVar242 * fVar101;
                fVar245 = fVar245 * fVar103;
                fVar247 = fVar247 * fVar136;
                local_4b8 = (float)((uint)(1.0 - fVar232) & uVar65 | ~uVar65 & (uint)fVar232);
                fStack_4b4 = (float)((uint)(1.0 - fVar242) & uVar67 | ~uVar67 & (uint)fVar242);
                fStack_4b0 = (float)((uint)(1.0 - fVar245) & uVar68 | ~uVar68 & (uint)fVar245);
                fStack_4ac = (float)((uint)(1.0 - fVar247) & uVar69 | ~uVar69 & (uint)fVar247);
                local_278 = (float)(~uVar65 & (uint)(auVar287._0_4_ * fVar71) |
                                   (uint)(1.0 - auVar287._0_4_ * fVar71) & uVar65);
                fStack_274 = (float)(~uVar67 & (uint)(auVar287._4_4_ * fVar101) |
                                    (uint)(1.0 - auVar287._4_4_ * fVar101) & uVar67);
                fStack_270 = (float)(~uVar68 & (uint)(auVar287._8_4_ * fVar103) |
                                    (uint)(1.0 - auVar287._8_4_ * fVar103) & uVar68);
                fStack_26c = (float)(~uVar69 & (uint)(auVar287._12_4_ * fVar136) |
                                    (uint)(1.0 - auVar287._12_4_ * fVar136) & uVar69);
                auVar133._8_4_ = auVar167._8_4_;
                auVar133._0_8_ = auVar167._0_8_;
                auVar133._12_4_ = auVar167._12_4_;
                local_4c8 = fVar126;
                fStack_4c4 = fVar127;
                fStack_4c0 = fVar128;
                fStack_4bc = fVar134;
              }
            }
            iVar50 = movmskps(iVar50,auVar133);
            fStack_2b0 = fVar248;
            fStack_2ac = fVar258;
            _local_258 = auVar211;
            if (iVar50 != 0) {
              fVar71 = (auVar286._0_4_ - auVar123._0_4_) * local_4b8 + auVar123._0_4_;
              fVar101 = (auVar286._4_4_ - auVar123._4_4_) * fStack_4b4 + auVar123._4_4_;
              fVar103 = (auVar286._8_4_ - auVar123._8_4_) * fStack_4b0 + auVar123._8_4_;
              fVar126 = (auVar286._12_4_ - auVar123._12_4_) * fStack_4ac + auVar123._12_4_;
              fVar135 = *(float *)((long)local_300->ray_space + k * 4 + -0x10);
              auVar96._0_4_ = -(uint)(fVar135 * (fVar71 + fVar71) < local_4c8) & auVar133._0_4_;
              auVar96._4_4_ = -(uint)(fVar135 * (fVar101 + fVar101) < fStack_4c4) & auVar133._4_4_;
              auVar96._8_4_ = -(uint)(fVar135 * (fVar103 + fVar103) < fStack_4c0) & auVar133._8_4_;
              auVar96._12_4_ = -(uint)(fVar135 * (fVar126 + fVar126) < fStack_4bc) & auVar133._12_4_
              ;
              uVar65 = movmskps((int)local_300,auVar96);
              if (uVar65 != 0) {
                local_278 = local_278 + local_278 + -1.0;
                fStack_274 = fStack_274 + fStack_274 + -1.0;
                fStack_270 = fStack_270 + fStack_270 + -1.0;
                fStack_26c = fStack_26c + fStack_26c + -1.0;
                local_188 = CONCAT44(fStack_364,local_368);
                uStack_180 = CONCAT44(fStack_35c,fStack_360);
                local_178 = CONCAT44(fStack_294,local_298);
                uStack_170 = CONCAT44(fStack_28c,fStack_290);
                local_168 = CONCAT44(fStack_2a4,local_2a8);
                uStack_160 = CONCAT44(fStack_29c,fStack_2a0);
                local_158 = CONCAT44(fStack_284,local_288);
                uStack_150 = CONCAT44(fStack_27c,fStack_280);
                pGVar59 = (context->scene->geometries).items[local_3d0].ptr;
                local_1c8 = local_4b8;
                fStack_1c4 = fStack_4b4;
                fStack_1c0 = fStack_4b0;
                fStack_1bc = fStack_4ac;
                local_1b8 = local_278;
                fStack_1b4 = fStack_274;
                fStack_1b0 = fStack_270;
                fStack_1ac = fStack_26c;
                local_1a8 = local_4c8;
                fStack_1a4 = fStack_4c4;
                fStack_1a0 = fStack_4c0;
                fStack_19c = fStack_4bc;
                local_198 = uVar66;
                local_148 = auVar96;
                if ((pGVar59->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  puVar57 = (undefined1 *)0x0;
                  local_194 = iVar18;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (puVar57 = (undefined1 *)CONCAT71((int7)((ulong)context->args >> 8),1),
                        local_194 = iVar18, pGVar59->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar135 = (float)(int)uVar66;
                  local_138[0] = (fVar135 + local_4b8 + 0.0) * local_78;
                  local_138[1] = (fVar135 + fStack_4b4 + 1.0) * fStack_74;
                  local_138[2] = (fVar135 + fStack_4b0 + 2.0) * fStack_70;
                  local_138[3] = (fVar135 + fStack_4ac + 3.0) * fStack_6c;
                  local_128 = CONCAT44(fStack_274,local_278);
                  uStack_120 = CONCAT44(fStack_26c,fStack_270);
                  local_118[0] = local_4c8;
                  local_118[1] = fStack_4c4;
                  local_118[2] = fStack_4c0;
                  local_118[3] = fStack_4bc;
                  uVar62 = (ulong)(uVar65 & 0xff);
                  uVar60 = 0;
                  if (uVar62 != 0) {
                    for (; ((uVar65 & 0xff) >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                    }
                  }
                  auVar72 = *local_308;
                  uVar55 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_194 = iVar18;
                  do {
                    local_d8 = local_138[uVar60];
                    local_c8 = *(undefined4 *)((long)&local_128 + uVar60 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_118[uVar60];
                    fVar135 = 1.0 - local_d8;
                    fVar101 = local_d8 * fVar135 + local_d8 * fVar135;
                    fVar103 = (fVar101 - local_d8 * local_d8) * 3.0;
                    fVar71 = local_d8 * local_d8 * 3.0;
                    fVar101 = (fVar135 * fVar135 - fVar101) * 3.0;
                    local_2f8.context = context->user;
                    fVar135 = fVar135 * fVar135 * -3.0;
                    local_108 = fVar135 * local_368 +
                                fVar101 * local_298 + fVar103 * local_2a8 + fVar71 * local_288;
                    local_f8 = fVar135 * fStack_364 +
                               fVar101 * fStack_294 + fVar103 * fStack_2a4 + fVar71 * fStack_284;
                    local_e8 = fVar135 * fStack_360 +
                               fVar101 * fStack_290 + fVar103 * fStack_2a0 + fVar71 * fStack_280;
                    fStack_104 = local_108;
                    fStack_100 = local_108;
                    fStack_fc = local_108;
                    fStack_f4 = local_f8;
                    fStack_f0 = local_f8;
                    fStack_ec = local_f8;
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    uStack_c4 = local_c8;
                    uStack_c0 = local_c8;
                    uStack_bc = local_c8;
                    local_b8 = CONCAT44(uStack_64,local_68);
                    uStack_b0 = CONCAT44(uStack_5c,uStack_60);
                    local_a8 = local_2c8._0_8_;
                    uStack_a0 = local_2c8._8_8_;
                    local_98 = (local_2f8.context)->instID[0];
                    uStack_94 = local_98;
                    uStack_90 = local_98;
                    uStack_8c = local_98;
                    local_88 = (local_2f8.context)->instPrimID[0];
                    uStack_84 = local_88;
                    uStack_80 = local_88;
                    uStack_7c = local_88;
                    local_2f8.valid = (int *)local_3e8;
                    pRVar56 = (RTCIntersectArguments *)pGVar59->userPtr;
                    local_2f8.hit = (RTCHitN *)&local_108;
                    local_2f8.N = 4;
                    p_Var53 = pGVar59->occlusionFilterN;
                    local_3e8 = auVar72;
                    local_2f8.geometryUserPtr = pRVar56;
                    local_2f8.ray = (RTCRayN *)ray;
                    if (p_Var53 != (RTCFilterFunctionN)0x0) {
                      p_Var53 = (RTCFilterFunctionN)(*p_Var53)(&local_2f8);
                    }
                    auVar124._0_4_ = -(uint)(local_3e8._0_4_ == 0);
                    auVar124._4_4_ = -(uint)(local_3e8._4_4_ == 0);
                    auVar124._8_4_ = -(uint)(local_3e8._8_4_ == 0);
                    auVar124._12_4_ = -(uint)(local_3e8._12_4_ == 0);
                    uVar65 = movmskps((int)p_Var53,auVar124);
                    pRVar54 = (RTCRayN *)(ulong)(uVar65 ^ 0xf);
                    if ((uVar65 ^ 0xf) == 0) {
                      auVar124 = auVar124 ^ _DAT_01f7ae20;
                    }
                    else {
                      pRVar56 = context->args;
                      if ((pRVar56->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar56->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar59->field_8).field_0x2 & 0x40) != 0)))) {
                        (*pRVar56->filter)(&local_2f8);
                      }
                      auVar97._0_4_ = -(uint)(local_3e8._0_4_ == 0);
                      auVar97._4_4_ = -(uint)(local_3e8._4_4_ == 0);
                      auVar97._8_4_ = -(uint)(local_3e8._8_4_ == 0);
                      auVar97._12_4_ = -(uint)(local_3e8._12_4_ == 0);
                      auVar124 = auVar97 ^ _DAT_01f7ae20;
                      *(undefined1 (*) [16])(local_2f8.ray + 0x80) =
                           ~auVar97 & _DAT_01f7aa00 |
                           *(undefined1 (*) [16])(local_2f8.ray + 0x80) & auVar97;
                      pRVar54 = local_2f8.ray;
                    }
                    auVar125._0_4_ = auVar124._0_4_ << 0x1f;
                    auVar125._4_4_ = auVar124._4_4_ << 0x1f;
                    auVar125._8_4_ = auVar124._8_4_ << 0x1f;
                    auVar125._12_4_ = auVar124._12_4_ << 0x1f;
                    iVar50 = movmskps((int)pRVar54,auVar125);
                    if (iVar50 != 0) {
                      puVar57 = (undefined1 *)CONCAT71((int7)((ulong)pRVar56 >> 8),1);
                      break;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar55;
                    uVar62 = uVar62 ^ 1L << (uVar60 & 0x3f);
                    uVar60 = 0;
                    if (uVar62 != 0) {
                      for (; (uVar62 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
                      }
                    }
                    puVar57 = (undefined1 *)0x0;
                  } while (uVar62 != 0);
                }
                bVar61 = (bool)(bVar61 | (byte)puVar57);
              }
            }
          }
          uVar55 = SUB84(puVar57,0);
          lVar63 = lVar63 + 4;
        } while ((int)lVar63 < iVar18);
      }
      if (bVar61 != false) {
        return bVar61;
      }
      fVar135 = *(float *)(ray + k * 4 + 0x80);
      auVar122._4_4_ = -(uint)(fStack_44 <= fVar135);
      auVar122._0_4_ = -(uint)(local_48 <= fVar135);
      auVar122._8_4_ = -(uint)(fStack_40 <= fVar135);
      auVar122._12_4_ = -(uint)(fStack_3c <= fVar135);
      uVar65 = movmskps(uVar55,auVar122);
      uVar64 = uVar64 & uVar64 + 0xf & uVar65;
    } while (uVar64 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }